

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Primitive PVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCRayQueryContext *pRVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  ulong uVar82;
  ulong uVar83;
  byte bVar84;
  byte bVar85;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  Primitive *pPVar86;
  uint uVar87;
  long lVar88;
  bool bVar89;
  ulong uVar90;
  uint uVar91;
  uint uVar146;
  uint uVar147;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  uint uVar148;
  uint uVar152;
  undefined1 auVar139 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  float pp;
  float fVar153;
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar216;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar214;
  float fVar215;
  undefined1 auVar213 [64];
  float fVar217;
  float fVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  float fVar238;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar239 [64];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar240 [32];
  float fVar244;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar249 [64];
  float fVar253;
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [16];
  float fVar258;
  undefined1 auVar257 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 (*local_930) [32];
  Primitive *local_928;
  Primitive *local_920;
  ulong local_918;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar133 [32];
  undefined1 auVar141 [32];
  undefined1 auVar144 [32];
  
  PVar7 = prim[1];
  uVar83 = (ulong)(byte)PVar7;
  lVar88 = uVar83 * 0x19;
  fVar218 = *(float *)(prim + lVar88 + 0x12);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar98 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar97 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + lVar88 + 6));
  fVar217 = fVar218 * auVar97._0_4_;
  fVar153 = fVar218 * auVar98._0_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar94);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar104 = vpmovsxbd_avx2(auVar19);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar107 = vpmovsxbd_avx2(auVar95);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar108 = vpmovsxbd_avx2(auVar254);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar113 = vpmovsxbd_avx2(auVar92);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar109 = vcvtdq2ps_avx(auVar113);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar83 + 6);
  auVar105 = vpmovsxbd_avx2(auVar6);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar90 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar110 = vpmovsxbd_avx2(auVar96);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar90 + uVar83 + 6);
  auVar111 = vpmovsxbd_avx2(auVar93);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar82 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar103 = vpmovsxbd_avx2(auVar267);
  auVar112 = vcvtdq2ps_avx(auVar103);
  auVar260 = ZEXT3264(auVar112);
  auVar123._4_4_ = fVar153;
  auVar123._0_4_ = fVar153;
  auVar123._8_4_ = fVar153;
  auVar123._12_4_ = fVar153;
  auVar123._16_4_ = fVar153;
  auVar123._20_4_ = fVar153;
  auVar123._24_4_ = fVar153;
  auVar123._28_4_ = fVar153;
  auVar209._8_4_ = 1;
  auVar209._0_8_ = 0x100000001;
  auVar209._12_4_ = 1;
  auVar209._16_4_ = 1;
  auVar209._20_4_ = 1;
  auVar209._24_4_ = 1;
  auVar209._28_4_ = 1;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar115 = ZEXT1632(CONCAT412(fVar218 * auVar98._12_4_,
                                CONCAT48(fVar218 * auVar98._8_4_,
                                         CONCAT44(fVar218 * auVar98._4_4_,fVar153))));
  auVar114 = vpermps_avx2(auVar209,auVar115);
  auVar102 = vpermps_avx512vl(auVar101,auVar115);
  fVar153 = auVar102._0_4_;
  fVar241 = auVar102._4_4_;
  auVar115._4_4_ = fVar241 * auVar107._4_4_;
  auVar115._0_4_ = fVar153 * auVar107._0_4_;
  fVar242 = auVar102._8_4_;
  auVar115._8_4_ = fVar242 * auVar107._8_4_;
  fVar243 = auVar102._12_4_;
  auVar115._12_4_ = fVar243 * auVar107._12_4_;
  fVar250 = auVar102._16_4_;
  auVar115._16_4_ = fVar250 * auVar107._16_4_;
  fVar251 = auVar102._20_4_;
  auVar115._20_4_ = fVar251 * auVar107._20_4_;
  fVar252 = auVar102._24_4_;
  auVar115._24_4_ = fVar252 * auVar107._24_4_;
  auVar115._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar105._4_4_ * fVar241;
  auVar113._0_4_ = auVar105._0_4_ * fVar153;
  auVar113._8_4_ = auVar105._8_4_ * fVar242;
  auVar113._12_4_ = auVar105._12_4_ * fVar243;
  auVar113._16_4_ = auVar105._16_4_ * fVar250;
  auVar113._20_4_ = auVar105._20_4_ * fVar251;
  auVar113._24_4_ = auVar105._24_4_ * fVar252;
  auVar113._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar112._4_4_ * fVar241;
  auVar103._0_4_ = auVar112._0_4_ * fVar153;
  auVar103._8_4_ = auVar112._8_4_ * fVar242;
  auVar103._12_4_ = auVar112._12_4_ * fVar243;
  auVar103._16_4_ = auVar112._16_4_ * fVar250;
  auVar103._20_4_ = auVar112._20_4_ * fVar251;
  auVar103._24_4_ = auVar112._24_4_ * fVar252;
  auVar103._28_4_ = auVar102._28_4_;
  auVar94 = vfmadd231ps_fma(auVar115,auVar114,auVar104);
  auVar19 = vfmadd231ps_fma(auVar113,auVar114,auVar109);
  auVar95 = vfmadd231ps_fma(auVar103,auVar111,auVar114);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar123,auVar106);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,auVar108);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar110,auVar123);
  auVar124._4_4_ = fVar217;
  auVar124._0_4_ = fVar217;
  auVar124._8_4_ = fVar217;
  auVar124._12_4_ = fVar217;
  auVar124._16_4_ = fVar217;
  auVar124._20_4_ = fVar217;
  auVar124._24_4_ = fVar217;
  auVar124._28_4_ = fVar217;
  auVar265 = ZEXT3264(auVar124);
  auVar103 = ZEXT1632(CONCAT412(fVar218 * auVar97._12_4_,
                                CONCAT48(fVar218 * auVar97._8_4_,
                                         CONCAT44(fVar218 * auVar97._4_4_,fVar217))));
  auVar113 = vpermps_avx2(auVar209,auVar103);
  auVar103 = vpermps_avx512vl(auVar101,auVar103);
  fVar218 = auVar103._0_4_;
  fVar153 = auVar103._4_4_;
  auVar114._4_4_ = fVar153 * auVar107._4_4_;
  auVar114._0_4_ = fVar218 * auVar107._0_4_;
  fVar241 = auVar103._8_4_;
  auVar114._8_4_ = fVar241 * auVar107._8_4_;
  fVar242 = auVar103._12_4_;
  auVar114._12_4_ = fVar242 * auVar107._12_4_;
  fVar243 = auVar103._16_4_;
  auVar114._16_4_ = fVar243 * auVar107._16_4_;
  fVar250 = auVar103._20_4_;
  auVar114._20_4_ = fVar250 * auVar107._20_4_;
  fVar251 = auVar103._24_4_;
  auVar114._24_4_ = fVar251 * auVar107._24_4_;
  auVar114._28_4_ = 1;
  auVar101._4_4_ = auVar105._4_4_ * fVar153;
  auVar101._0_4_ = auVar105._0_4_ * fVar218;
  auVar101._8_4_ = auVar105._8_4_ * fVar241;
  auVar101._12_4_ = auVar105._12_4_ * fVar242;
  auVar101._16_4_ = auVar105._16_4_ * fVar243;
  auVar101._20_4_ = auVar105._20_4_ * fVar250;
  auVar101._24_4_ = auVar105._24_4_ * fVar251;
  auVar101._28_4_ = auVar107._28_4_;
  auVar105._4_4_ = auVar112._4_4_ * fVar153;
  auVar105._0_4_ = auVar112._0_4_ * fVar218;
  auVar105._8_4_ = auVar112._8_4_ * fVar241;
  auVar105._12_4_ = auVar112._12_4_ * fVar242;
  auVar105._16_4_ = auVar112._16_4_ * fVar243;
  auVar105._20_4_ = auVar112._20_4_ * fVar250;
  auVar105._24_4_ = auVar112._24_4_ * fVar251;
  auVar105._28_4_ = auVar103._28_4_;
  auVar254 = vfmadd231ps_fma(auVar114,auVar113,auVar104);
  auVar92 = vfmadd231ps_fma(auVar101,auVar113,auVar109);
  auVar6 = vfmadd231ps_fma(auVar105,auVar113,auVar111);
  auVar254 = vfmadd231ps_fma(ZEXT1632(auVar254),auVar124,auVar106);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar124,auVar108);
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar124,auVar110);
  auVar106 = vandps_avx(ZEXT1632(auVar94),auVar120);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  uVar90 = vcmpps_avx512vl(auVar106,auVar122,1);
  bVar12 = (bool)((byte)uVar90 & 1);
  auVar102._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._0_4_;
  bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._4_4_;
  bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._8_4_;
  bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar94._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar90 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(ZEXT1632(auVar19),auVar120);
  uVar90 = vcmpps_avx512vl(auVar106,auVar122,1);
  bVar12 = (bool)((byte)uVar90 & 1);
  auVar116._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._0_4_;
  bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar116._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._4_4_;
  bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar116._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._8_4_;
  bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar116._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._12_4_;
  auVar116._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * 0x219392ef;
  auVar116._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * 0x219392ef;
  auVar116._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * 0x219392ef;
  auVar116._28_4_ = (uint)(byte)(uVar90 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(ZEXT1632(auVar95),auVar120);
  uVar90 = vcmpps_avx512vl(auVar106,auVar122,1);
  bVar12 = (bool)((byte)uVar90 & 1);
  auVar106._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar95._0_4_;
  bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar95._4_4_;
  bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar95._8_4_;
  bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar95._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar90 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar121._8_4_ = 0x3f800000;
  auVar121._0_8_ = &DAT_3f8000003f800000;
  auVar121._12_4_ = 0x3f800000;
  auVar121._16_4_ = 0x3f800000;
  auVar121._20_4_ = 0x3f800000;
  auVar121._24_4_ = 0x3f800000;
  auVar121._28_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar102,auVar104,auVar121);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar116);
  auVar19 = vfnmadd213ps_fma(auVar116,auVar104,auVar121);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar106);
  auVar95 = vfnmadd213ps_fma(auVar106,auVar104,auVar121);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar104,auVar104);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar254));
  auVar110._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar110._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar110._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar110._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar110._16_4_ = auVar106._16_4_ * 0.0;
  auVar110._20_4_ = auVar106._20_4_ * 0.0;
  auVar110._24_4_ = auVar106._24_4_ * 0.0;
  auVar110._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar254));
  auVar105 = vpbroadcastd_avx512vl();
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar119._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar119._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar119._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar119._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar119._16_4_ = auVar106._16_4_ * 0.0;
  auVar119._20_4_ = auVar106._20_4_ * 0.0;
  auVar119._24_4_ = auVar106._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar7 * 0x10 + uVar83 * -2 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar92));
  auVar111._4_4_ = auVar19._4_4_ * auVar106._4_4_;
  auVar111._0_4_ = auVar19._0_4_ * auVar106._0_4_;
  auVar111._8_4_ = auVar19._8_4_ * auVar106._8_4_;
  auVar111._12_4_ = auVar19._12_4_ * auVar106._12_4_;
  auVar111._16_4_ = auVar106._16_4_ * 0.0;
  auVar111._20_4_ = auVar106._20_4_ * 0.0;
  auVar111._24_4_ = auVar106._24_4_ * 0.0;
  auVar111._28_4_ = auVar106._28_4_;
  auVar106 = vcvtdq2ps_avx(auVar104);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar92));
  auVar118._0_4_ = auVar19._0_4_ * auVar106._0_4_;
  auVar118._4_4_ = auVar19._4_4_ * auVar106._4_4_;
  auVar118._8_4_ = auVar19._8_4_ * auVar106._8_4_;
  auVar118._12_4_ = auVar19._12_4_ * auVar106._12_4_;
  auVar118._16_4_ = auVar106._16_4_ * 0.0;
  auVar118._20_4_ = auVar106._20_4_ * 0.0;
  auVar118._24_4_ = auVar106._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + uVar83 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar6));
  auVar112._4_4_ = auVar106._4_4_ * auVar95._4_4_;
  auVar112._0_4_ = auVar106._0_4_ * auVar95._0_4_;
  auVar112._8_4_ = auVar106._8_4_ * auVar95._8_4_;
  auVar112._12_4_ = auVar106._12_4_ * auVar95._12_4_;
  auVar112._16_4_ = auVar106._16_4_ * 0.0;
  auVar112._20_4_ = auVar106._20_4_ * 0.0;
  auVar112._24_4_ = auVar106._24_4_ * 0.0;
  auVar112._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar6));
  auVar117._0_4_ = auVar95._0_4_ * auVar106._0_4_;
  auVar117._4_4_ = auVar95._4_4_ * auVar106._4_4_;
  auVar117._8_4_ = auVar95._8_4_ * auVar106._8_4_;
  auVar117._12_4_ = auVar95._12_4_ * auVar106._12_4_;
  auVar117._16_4_ = auVar106._16_4_ * 0.0;
  auVar117._20_4_ = auVar106._20_4_ * 0.0;
  auVar117._24_4_ = auVar106._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar106 = vpminsd_avx2(auVar110,auVar119);
  auVar104 = vpminsd_avx2(auVar111,auVar118);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar104 = vpminsd_avx2(auVar112,auVar117);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar107._4_4_ = uVar5;
  auVar107._0_4_ = uVar5;
  auVar107._8_4_ = uVar5;
  auVar107._12_4_ = uVar5;
  auVar107._16_4_ = uVar5;
  auVar107._20_4_ = uVar5;
  auVar107._24_4_ = uVar5;
  auVar107._28_4_ = uVar5;
  auVar104 = vmaxps_avx512vl(auVar104,auVar107);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  auVar104._16_4_ = 0x3f7ffffa;
  auVar104._20_4_ = 0x3f7ffffa;
  auVar104._24_4_ = 0x3f7ffffa;
  auVar104._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar106,auVar104);
  auVar106 = vpmaxsd_avx2(auVar110,auVar119);
  auVar104 = vpmaxsd_avx2(auVar111,auVar118);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar104 = vpmaxsd_avx2(auVar112,auVar117);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar108._4_4_ = uVar5;
  auVar108._0_4_ = uVar5;
  auVar108._8_4_ = uVar5;
  auVar108._12_4_ = uVar5;
  auVar108._16_4_ = uVar5;
  auVar108._20_4_ = uVar5;
  auVar108._24_4_ = uVar5;
  auVar108._28_4_ = uVar5;
  auVar104 = vminps_avx512vl(auVar104,auVar108);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar109._8_4_ = 0x3f800003;
  auVar109._0_8_ = 0x3f8000033f800003;
  auVar109._12_4_ = 0x3f800003;
  auVar109._16_4_ = 0x3f800003;
  auVar109._20_4_ = 0x3f800003;
  auVar109._24_4_ = 0x3f800003;
  auVar109._28_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar109);
  uVar22 = vpcmpgtd_avx512vl(auVar105,_DAT_0205a920);
  uVar20 = vcmpps_avx512vl(local_420,auVar106,2);
  if ((byte)((byte)uVar20 & (byte)uVar22) == 0) {
    return;
  }
  local_908 = (ulong)(byte)((byte)uVar20 & (byte)uVar22);
  pPVar86 = prim + lVar88 + 0x16;
  local_930 = (undefined1 (*) [32])&local_4c0;
  local_660 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_928 = pPVar86;
  local_920 = prim;
LAB_01d4296d:
  lVar88 = 0;
  for (uVar90 = local_908; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    lVar88 = lVar88 + 1;
  }
  local_908 = local_908 - 1 & local_908;
  uVar5 = *(undefined4 *)(prim + lVar88 * 4 + 6);
  uVar90 = (ulong)(uint)((int)lVar88 << 6);
  auVar94 = *(undefined1 (*) [16])(pPVar86 + uVar90);
  if (local_908 != 0) {
    uVar83 = local_908 - 1 & local_908;
    for (uVar82 = local_908; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar19 = *(undefined1 (*) [16])(pPVar86 + uVar90 + 0x10);
  auVar95 = *(undefined1 (*) [16])(pPVar86 + uVar90 + 0x20);
  auVar254 = *(undefined1 (*) [16])(pPVar86 + uVar90 + 0x30);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar6 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_5c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_8e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar269 = ZEXT3264(local_8e0);
  auVar92 = vunpcklps_avx512vl(local_5c0._0_16_,local_8e0._0_16_);
  local_900 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar268 = ZEXT3264(local_900);
  auVar267 = local_900._0_16_;
  local_870 = vinsertps_avx512f(auVar92,auVar267,0x28);
  auVar249 = ZEXT1664(local_870);
  auVar97._0_4_ = auVar94._0_4_ + auVar19._0_4_ + auVar95._0_4_ + auVar254._0_4_;
  auVar97._4_4_ = auVar94._4_4_ + auVar19._4_4_ + auVar95._4_4_ + auVar254._4_4_;
  auVar97._8_4_ = auVar94._8_4_ + auVar19._8_4_ + auVar95._8_4_ + auVar254._8_4_;
  auVar97._12_4_ = auVar94._12_4_ + auVar19._12_4_ + auVar95._12_4_ + auVar254._12_4_;
  auVar98._8_4_ = 0x3e800000;
  auVar98._0_8_ = 0x3e8000003e800000;
  auVar98._12_4_ = 0x3e800000;
  auVar92 = vmulps_avx512vl(auVar97,auVar98);
  auVar92 = vsubps_avx(auVar92,auVar6);
  auVar92 = vdpps_avx(auVar92,local_870,0x7f);
  fVar218 = *(float *)(ray + k * 4 + 0x60);
  auVar255 = ZEXT464((uint)fVar218);
  local_880 = vdpps_avx(local_870,local_870,0x7f);
  uVar87 = *(uint *)(prim + 2);
  auVar99._4_12_ = ZEXT812(0) << 0x20;
  auVar99._0_4_ = local_880._0_4_;
  auVar93 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar99);
  auVar96 = vfnmadd213ss_fma(auVar93,local_880,ZEXT416(0x40000000));
  local_400 = auVar92._0_4_ * auVar93._0_4_ * auVar96._0_4_;
  auVar239 = ZEXT464((uint)local_400);
  auVar100._4_4_ = local_400;
  auVar100._0_4_ = local_400;
  auVar100._8_4_ = local_400;
  auVar100._12_4_ = local_400;
  fStack_710 = local_400;
  _local_720 = auVar100;
  fStack_70c = local_400;
  fStack_708 = local_400;
  fStack_704 = local_400;
  auVar92 = vfmadd231ps_fma(auVar6,local_870,auVar100);
  auVar92 = vblendps_avx(auVar92,ZEXT816(0) << 0x40,8);
  auVar94 = vsubps_avx(auVar94,auVar92);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar19 = vsubps_avx(auVar19,auVar92);
  auVar248 = ZEXT1664(auVar19);
  auVar254 = vsubps_avx(auVar254,auVar92);
  local_1e0 = auVar94._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  auVar126._8_4_ = 1;
  auVar126._0_8_ = 0x100000001;
  auVar126._12_4_ = 1;
  auVar126._16_4_ = 1;
  auVar126._20_4_ = 1;
  auVar126._24_4_ = 1;
  auVar126._28_4_ = 1;
  local_800 = ZEXT1632(auVar94);
  local_200 = vpermps_avx2(auVar126,local_800);
  auVar129._8_4_ = 2;
  auVar129._0_8_ = 0x200000002;
  auVar129._12_4_ = 2;
  auVar129._16_4_ = 2;
  auVar129._20_4_ = 2;
  auVar129._24_4_ = 2;
  auVar129._28_4_ = 2;
  local_220 = vpermps_avx2(auVar129,local_800);
  auVar130._8_4_ = 3;
  auVar130._0_8_ = 0x300000003;
  auVar130._12_4_ = 3;
  auVar130._16_4_ = 3;
  auVar130._20_4_ = 3;
  auVar130._24_4_ = 3;
  auVar130._28_4_ = 3;
  local_240 = vpermps_avx2(auVar130,local_800);
  local_260 = auVar19._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_840 = ZEXT1632(auVar19);
  local_280 = vpermps_avx2(auVar126,local_840);
  local_2a0 = vpermps_avx2(auVar129,local_840);
  local_2c0 = vpermps_avx2(auVar130,local_840);
  local_2e0 = auVar95._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_820 = ZEXT1632(auVar95);
  local_300 = vpermps_avx2(auVar126,local_820);
  local_320 = vpermps_avx2(auVar129,local_820);
  local_340 = vpermps_avx2(auVar130,local_820);
  local_360 = auVar254._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_860 = ZEXT1632(auVar254);
  local_380 = vpermps_avx2(auVar126,_local_860);
  local_3a0 = vpermps_avx2(auVar129,_local_860);
  local_3c0 = vpermps_avx2(auVar130,_local_860);
  auVar94 = vmulss_avx512f(auVar267,auVar267);
  auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),local_8e0,local_8e0);
  local_5e0 = vfmadd231ps_avx512vl(auVar106,local_5c0,local_5c0);
  local_3e0._0_4_ = local_5e0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar125._8_4_ = 0x7fffffff;
  auVar125._0_8_ = 0x7fffffff7fffffff;
  auVar125._12_4_ = 0x7fffffff;
  auVar125._16_4_ = 0x7fffffff;
  auVar125._20_4_ = 0x7fffffff;
  auVar125._24_4_ = 0x7fffffff;
  auVar125._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar125);
  local_7a0 = ZEXT416((uint)local_400);
  local_400 = fVar218 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_620 = vpbroadcastd_avx512vl();
  local_918 = 1;
  local_910 = 0;
  local_640 = vpbroadcastd_avx512vl();
  auVar94 = vsqrtss_avx(local_880,local_880);
  auVar19 = vsqrtss_avx(local_880,local_880);
  auVar213 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar266 = ZEXT3264(auVar106);
  do {
    local_940 = auVar213._0_16_;
    auVar95 = vmovshdup_avx(local_940);
    fVar153 = auVar213._0_4_;
    fVar258 = auVar95._0_4_ - fVar153;
    fVar198 = fVar258 * 0.04761905;
    auVar233._4_4_ = fVar153;
    auVar233._0_4_ = fVar153;
    auVar233._8_4_ = fVar153;
    auVar233._12_4_ = fVar153;
    auVar233._16_4_ = fVar153;
    auVar233._20_4_ = fVar153;
    auVar233._24_4_ = fVar153;
    auVar233._28_4_ = fVar153;
    local_8a0._4_4_ = fVar258;
    local_8a0._0_4_ = fVar258;
    local_8a0._8_4_ = fVar258;
    local_8a0._12_4_ = fVar258;
    local_8a0._16_4_ = fVar258;
    local_8a0._20_4_ = fVar258;
    local_8a0._24_4_ = fVar258;
    local_8a0._28_4_ = fVar258;
    auVar95 = vfmadd231ps_fma(auVar233,local_8a0,_DAT_02020f20);
    auVar104 = vsubps_avx512vl(auVar266._0_32_,ZEXT1632(auVar95));
    fVar153 = auVar104._0_4_;
    fVar242 = auVar104._4_4_;
    fVar250 = auVar104._8_4_;
    fVar252 = auVar104._12_4_;
    fVar244 = auVar104._16_4_;
    fVar238 = auVar104._20_4_;
    fVar253 = auVar104._24_4_;
    fVar154 = fVar153 * fVar153 * fVar153;
    fVar173 = fVar242 * fVar242 * fVar242;
    auVar38._4_4_ = fVar173;
    auVar38._0_4_ = fVar154;
    fVar174 = fVar250 * fVar250 * fVar250;
    auVar38._8_4_ = fVar174;
    fVar175 = fVar252 * fVar252 * fVar252;
    auVar38._12_4_ = fVar175;
    fVar176 = fVar244 * fVar244 * fVar244;
    auVar38._16_4_ = fVar176;
    fVar177 = fVar238 * fVar238 * fVar238;
    auVar38._20_4_ = fVar177;
    fVar178 = fVar253 * fVar253 * fVar253;
    auVar38._24_4_ = fVar178;
    auVar38._28_4_ = fVar258;
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar106 = vmulps_avx512vl(auVar38,auVar105);
    fVar241 = auVar95._0_4_;
    fVar243 = auVar95._4_4_;
    fVar251 = auVar95._8_4_;
    fVar217 = auVar95._12_4_;
    fVar197 = fVar241 * fVar241 * fVar241;
    fVar214 = fVar243 * fVar243 * fVar243;
    fVar215 = fVar251 * fVar251 * fVar251;
    fVar216 = fVar217 * fVar217 * fVar217;
    auVar213._0_28_ = ZEXT1628(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar197))));
    auVar266._0_4_ = fVar241 * fVar153;
    auVar266._4_4_ = fVar243 * fVar242;
    auVar266._8_4_ = fVar251 * fVar250;
    auVar266._12_4_ = fVar217 * fVar252;
    auVar266._16_4_ = fVar244 * 0.0;
    auVar266._20_4_ = fVar238 * 0.0;
    auVar266._28_36_ = auVar255._28_36_;
    auVar266._24_4_ = fVar253 * 0.0;
    auVar107 = vmulps_avx512vl(auVar213._0_32_,auVar105);
    fVar258 = auVar107._28_4_ + fVar258;
    auVar39._4_4_ = fVar173 * 0.16666667;
    auVar39._0_4_ = fVar154 * 0.16666667;
    auVar39._8_4_ = fVar174 * 0.16666667;
    auVar39._12_4_ = fVar175 * 0.16666667;
    auVar39._16_4_ = fVar176 * 0.16666667;
    auVar39._20_4_ = fVar177 * 0.16666667;
    auVar39._24_4_ = fVar178 * 0.16666667;
    auVar39._28_4_ = fVar258;
    auVar40._4_4_ =
         (auVar266._4_4_ * fVar242 * 12.0 + auVar266._4_4_ * fVar243 * 6.0 +
         fVar214 + auVar106._4_4_) * 0.16666667;
    auVar40._0_4_ =
         (auVar266._0_4_ * fVar153 * 12.0 + auVar266._0_4_ * fVar241 * 6.0 +
         fVar197 + auVar106._0_4_) * 0.16666667;
    auVar40._8_4_ =
         (auVar266._8_4_ * fVar250 * 12.0 + auVar266._8_4_ * fVar251 * 6.0 +
         fVar215 + auVar106._8_4_) * 0.16666667;
    auVar40._12_4_ =
         (auVar266._12_4_ * fVar252 * 12.0 + auVar266._12_4_ * fVar217 * 6.0 +
         fVar216 + auVar106._12_4_) * 0.16666667;
    auVar40._16_4_ =
         (auVar266._16_4_ * fVar244 * 12.0 + auVar266._16_4_ * 0.0 * 6.0 + auVar106._16_4_ + 0.0) *
         0.16666667;
    auVar40._20_4_ =
         (auVar266._20_4_ * fVar238 * 12.0 + auVar266._20_4_ * 0.0 * 6.0 + auVar106._20_4_ + 0.0) *
         0.16666667;
    auVar40._24_4_ =
         (auVar266._24_4_ * fVar253 * 12.0 + auVar266._24_4_ * 0.0 * 6.0 + auVar106._24_4_ + 0.0) *
         0.16666667;
    auVar40._28_4_ = auVar260._28_4_;
    auVar41._4_4_ =
         (auVar107._4_4_ + fVar173 +
         auVar266._4_4_ * fVar243 * 12.0 + auVar266._4_4_ * fVar242 * 6.0) * 0.16666667;
    auVar41._0_4_ =
         (auVar107._0_4_ + fVar154 +
         auVar266._0_4_ * fVar241 * 12.0 + auVar266._0_4_ * fVar153 * 6.0) * 0.16666667;
    auVar41._8_4_ =
         (auVar107._8_4_ + fVar174 +
         auVar266._8_4_ * fVar251 * 12.0 + auVar266._8_4_ * fVar250 * 6.0) * 0.16666667;
    auVar41._12_4_ =
         (auVar107._12_4_ + fVar175 +
         auVar266._12_4_ * fVar217 * 12.0 + auVar266._12_4_ * fVar252 * 6.0) * 0.16666667;
    auVar41._16_4_ =
         (auVar107._16_4_ + fVar176 + auVar266._16_4_ * 0.0 * 12.0 + auVar266._16_4_ * fVar244 * 6.0
         ) * 0.16666667;
    auVar41._20_4_ =
         (auVar107._20_4_ + fVar177 + auVar266._20_4_ * 0.0 * 12.0 + auVar266._20_4_ * fVar238 * 6.0
         ) * 0.16666667;
    auVar41._24_4_ =
         (auVar107._24_4_ + fVar178 + auVar266._24_4_ * 0.0 * 12.0 + auVar266._24_4_ * fVar253 * 6.0
         ) * 0.16666667;
    auVar41._28_4_ = auVar265._28_4_;
    auVar42._28_4_ = fVar258 + auVar260._28_4_ + auVar239._28_4_;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * 0.16666667,
                            CONCAT48(fVar215 * 0.16666667,
                                     CONCAT44(fVar214 * 0.16666667,fVar197 * 0.16666667))));
    auVar74._4_4_ = uStack_35c;
    auVar74._0_4_ = local_360;
    auVar74._8_4_ = uStack_358;
    auVar74._12_4_ = uStack_354;
    auVar74._16_4_ = uStack_350;
    auVar74._20_4_ = uStack_34c;
    auVar74._24_4_ = uStack_348;
    auVar74._28_4_ = uStack_344;
    auVar106 = vmulps_avx512vl(auVar74,auVar42);
    auVar107 = vmulps_avx512vl(local_380,auVar42);
    auVar108 = vmulps_avx512vl(local_3a0,auVar42);
    auVar109 = vmulps_avx512vl(local_3c0,auVar42);
    auVar75._4_4_ = uStack_2dc;
    auVar75._0_4_ = local_2e0;
    auVar75._8_4_ = uStack_2d8;
    auVar75._12_4_ = uStack_2d4;
    auVar75._16_4_ = uStack_2d0;
    auVar75._20_4_ = uStack_2cc;
    auVar75._24_4_ = uStack_2c8;
    auVar75._28_4_ = uStack_2c4;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar41,auVar75);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar41,local_300);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar41,local_320);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_340,auVar41);
    auVar76._4_4_ = uStack_25c;
    auVar76._0_4_ = local_260;
    auVar76._8_4_ = uStack_258;
    auVar76._12_4_ = uStack_254;
    auVar76._16_4_ = uStack_250;
    auVar76._20_4_ = uStack_24c;
    auVar76._24_4_ = uStack_248;
    auVar76._28_4_ = uStack_244;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar40,auVar76);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar40,local_280);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar40,local_2a0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_2c0,auVar40);
    auVar77._4_4_ = fStack_1dc;
    auVar77._0_4_ = local_1e0;
    auVar77._8_4_ = fStack_1d8;
    auVar77._12_4_ = fStack_1d4;
    auVar77._16_4_ = fStack_1d0;
    auVar77._20_4_ = fStack_1cc;
    auVar77._24_4_ = fStack_1c8;
    auVar77._28_4_ = fStack_1c4;
    auVar254 = vfmadd231ps_fma(auVar106,auVar39,auVar77);
    auVar92 = vfmadd231ps_fma(auVar107,auVar39,local_200);
    auVar6 = vfmadd231ps_fma(auVar108,auVar39,local_220);
    auVar96 = vfmadd231ps_fma(auVar109,local_240,auVar39);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar107 = vxorps_avx512vl(auVar104,auVar106);
    auVar108 = vxorps_avx512vl(ZEXT1632(auVar95),auVar106);
    auVar234._0_4_ = auVar108._0_4_ * fVar241;
    auVar234._4_4_ = auVar108._4_4_ * fVar243;
    auVar234._8_4_ = auVar108._8_4_ * fVar251;
    auVar234._12_4_ = auVar108._12_4_ * fVar217;
    auVar234._16_4_ = auVar108._16_4_ * 0.0;
    auVar234._20_4_ = auVar108._20_4_ * 0.0;
    auVar234._24_4_ = auVar108._24_4_ * 0.0;
    auVar234._28_4_ = 0;
    auVar109 = vmulps_avx512vl(auVar266._0_32_,auVar105);
    auVar106 = vsubps_avx(auVar234,auVar109);
    auVar43._4_4_ = auVar107._4_4_ * fVar242 * 0.5;
    auVar43._0_4_ = auVar107._0_4_ * fVar153 * 0.5;
    auVar43._8_4_ = auVar107._8_4_ * fVar250 * 0.5;
    auVar43._12_4_ = auVar107._12_4_ * fVar252 * 0.5;
    auVar43._16_4_ = auVar107._16_4_ * fVar244 * 0.5;
    auVar43._20_4_ = auVar107._20_4_ * fVar238 * 0.5;
    auVar43._24_4_ = auVar107._24_4_ * fVar253 * 0.5;
    auVar43._28_4_ = auVar104._28_4_;
    auVar44._4_4_ = auVar106._4_4_ * 0.5;
    auVar44._0_4_ = auVar106._0_4_ * 0.5;
    auVar44._8_4_ = auVar106._8_4_ * 0.5;
    auVar44._12_4_ = auVar106._12_4_ * 0.5;
    auVar44._16_4_ = auVar106._16_4_ * 0.5;
    auVar44._20_4_ = auVar106._20_4_ * 0.5;
    auVar44._24_4_ = auVar106._24_4_ * 0.5;
    auVar44._28_4_ = auVar106._28_4_;
    auVar45._4_4_ = (fVar242 * fVar242 + auVar109._4_4_) * 0.5;
    auVar45._0_4_ = (fVar153 * fVar153 + auVar109._0_4_) * 0.5;
    auVar45._8_4_ = (fVar250 * fVar250 + auVar109._8_4_) * 0.5;
    auVar45._12_4_ = (fVar252 * fVar252 + auVar109._12_4_) * 0.5;
    auVar45._16_4_ = (fVar244 * fVar244 + auVar109._16_4_) * 0.5;
    auVar45._20_4_ = (fVar238 * fVar238 + auVar109._20_4_) * 0.5;
    auVar45._24_4_ = (fVar253 * fVar253 + auVar109._24_4_) * 0.5;
    auVar45._28_4_ = auVar248._28_4_ + auVar109._28_4_;
    auVar46._28_4_ = auVar249._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar217 * fVar217 * 0.5,
                            CONCAT48(fVar251 * fVar251 * 0.5,
                                     CONCAT44(fVar243 * fVar243 * 0.5,fVar241 * fVar241 * 0.5))));
    auVar106 = vmulps_avx512vl(auVar74,auVar46);
    auVar104 = vmulps_avx512vl(local_380,auVar46);
    auVar107 = vmulps_avx512vl(local_3a0,auVar46);
    auVar109 = vmulps_avx512vl(local_3c0,auVar46);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar45,auVar75);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar45,local_300);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar45,local_320);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_340,auVar45);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar44,auVar76);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar44,local_280);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar44,local_2a0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_2c0,auVar44);
    auVar95 = vfmadd231ps_fma(auVar106,auVar43,auVar77);
    auVar93 = vfmadd231ps_fma(auVar104,auVar43,local_200);
    auVar267 = vfmadd231ps_fma(auVar107,auVar43,local_220);
    auVar98 = vfmadd231ps_fma(auVar109,local_240,auVar43);
    auVar47._4_4_ = auVar95._4_4_ * fVar198;
    auVar47._0_4_ = auVar95._0_4_ * fVar198;
    auVar47._8_4_ = auVar95._8_4_ * fVar198;
    auVar47._12_4_ = auVar95._12_4_ * fVar198;
    auVar47._16_4_ = fVar198 * 0.0;
    auVar47._20_4_ = fVar198 * 0.0;
    auVar47._24_4_ = fVar198 * 0.0;
    auVar47._28_4_ = auVar108._28_4_;
    auVar259._0_4_ = auVar93._0_4_ * fVar198;
    auVar259._4_4_ = auVar93._4_4_ * fVar198;
    auVar259._8_4_ = auVar93._8_4_ * fVar198;
    auVar259._12_4_ = auVar93._12_4_ * fVar198;
    auVar259._16_4_ = fVar198 * 0.0;
    auVar259._20_4_ = fVar198 * 0.0;
    auVar259._24_4_ = fVar198 * 0.0;
    auVar259._28_4_ = 0;
    auVar260 = ZEXT3264(auVar259);
    auVar263._0_4_ = auVar267._0_4_ * fVar198;
    auVar263._4_4_ = auVar267._4_4_ * fVar198;
    auVar263._8_4_ = auVar267._8_4_ * fVar198;
    auVar263._12_4_ = auVar267._12_4_ * fVar198;
    auVar263._16_4_ = fVar198 * 0.0;
    auVar263._20_4_ = fVar198 * 0.0;
    auVar263._24_4_ = fVar198 * 0.0;
    auVar263._28_4_ = 0;
    auVar265 = ZEXT3264(auVar263);
    fVar153 = auVar98._0_4_ * fVar198;
    fVar241 = auVar98._4_4_ * fVar198;
    auVar48._4_4_ = fVar241;
    auVar48._0_4_ = fVar153;
    fVar242 = auVar98._8_4_ * fVar198;
    auVar48._8_4_ = fVar242;
    fVar243 = auVar98._12_4_ * fVar198;
    auVar48._12_4_ = fVar243;
    auVar48._16_4_ = fVar198 * 0.0;
    auVar48._20_4_ = fVar198 * 0.0;
    auVar48._24_4_ = fVar198 * 0.0;
    auVar48._28_4_ = fStack_1c4;
    auVar95 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
    auVar110 = vpermt2ps_avx512vl(ZEXT1632(auVar254),_DAT_0205fd20,ZEXT1632(auVar95));
    auVar248 = ZEXT3264(auVar110);
    auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar92),_DAT_0205fd20,ZEXT1632(auVar95));
    auVar249 = ZEXT3264(auVar111);
    auVar107 = ZEXT1632(auVar95);
    auVar112 = vpermt2ps_avx512vl(ZEXT1632(auVar6),_DAT_0205fd20,auVar107);
    auVar255 = ZEXT3264(auVar112);
    auVar235._0_4_ = fVar153 + auVar96._0_4_;
    auVar235._4_4_ = fVar241 + auVar96._4_4_;
    auVar235._8_4_ = fVar242 + auVar96._8_4_;
    auVar235._12_4_ = fVar243 + auVar96._12_4_;
    auVar235._16_4_ = fVar198 * 0.0 + 0.0;
    auVar235._20_4_ = fVar198 * 0.0 + 0.0;
    auVar235._24_4_ = fVar198 * 0.0 + 0.0;
    auVar235._28_4_ = fStack_1c4 + 0.0;
    auVar106 = vmaxps_avx(ZEXT1632(auVar96),auVar235);
    auVar104 = vminps_avx(ZEXT1632(auVar96),auVar235);
    auVar113 = vpermt2ps_avx512vl(ZEXT1632(auVar96),_DAT_0205fd20,auVar107);
    auVar103 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar107);
    auVar114 = vpermt2ps_avx512vl(auVar259,_DAT_0205fd20,auVar107);
    auVar125 = ZEXT1632(auVar95);
    auVar115 = vpermt2ps_avx512vl(auVar263,_DAT_0205fd20,auVar125);
    auVar239 = ZEXT3264(auVar115);
    auVar107 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar125);
    auVar101 = vsubps_avx512vl(auVar113,auVar107);
    auVar107 = vsubps_avx(auVar110,ZEXT1632(auVar254));
    auVar108 = vsubps_avx(auVar111,ZEXT1632(auVar92));
    local_700 = vsubps_avx512vl(auVar112,ZEXT1632(auVar6));
    auVar109 = vmulps_avx512vl(auVar108,auVar263);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar259,local_700);
    auVar102 = vmulps_avx512vl(local_700,auVar47);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar263,auVar107);
    auVar116 = vmulps_avx512vl(auVar107,auVar259);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar47,auVar108);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar102 = vfmadd231ps_avx512vl(auVar116,auVar102,auVar102);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar109);
    auVar109 = vmulps_avx512vl(local_700,local_700);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar116 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar107);
    auVar117 = vrcp14ps_avx512vl(auVar116);
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar118 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar109);
    auVar117 = vfmadd132ps_avx512vl(auVar118,auVar117,auVar117);
    auVar102 = vmulps_avx512vl(auVar102,auVar117);
    auVar118 = vmulps_avx512vl(auVar108,auVar115);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar114,local_700);
    auVar119 = vmulps_avx512vl(local_700,auVar103);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar115,auVar107);
    auVar120 = vmulps_avx512vl(auVar107,auVar114);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar103,auVar108);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vmulps_avx512vl(auVar118,auVar117);
    auVar102 = vmaxps_avx512vl(auVar102,auVar117);
    auVar102 = vsqrtps_avx512vl(auVar102);
    auVar117 = vmaxps_avx512vl(auVar101,auVar113);
    auVar106 = vmaxps_avx512vl(auVar106,auVar117);
    auVar117 = vaddps_avx512vl(auVar102,auVar106);
    auVar106 = vminps_avx512vl(auVar101,auVar113);
    auVar106 = vminps_avx(auVar104,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar102);
    auVar131._8_4_ = 0x3f800002;
    auVar131._0_8_ = 0x3f8000023f800002;
    auVar131._12_4_ = 0x3f800002;
    auVar131._16_4_ = 0x3f800002;
    auVar131._20_4_ = 0x3f800002;
    auVar131._24_4_ = 0x3f800002;
    auVar131._28_4_ = 0x3f800002;
    auVar104 = vmulps_avx512vl(auVar117,auVar131);
    auVar132._8_4_ = 0x3f7ffffc;
    auVar132._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar132._12_4_ = 0x3f7ffffc;
    auVar132._16_4_ = 0x3f7ffffc;
    auVar132._20_4_ = 0x3f7ffffc;
    auVar132._24_4_ = 0x3f7ffffc;
    auVar132._28_4_ = 0x3f7ffffc;
    auVar113 = vmulps_avx512vl(auVar106,auVar132);
    auVar49._4_4_ = auVar104._4_4_ * auVar104._4_4_;
    auVar49._0_4_ = auVar104._0_4_ * auVar104._0_4_;
    auVar49._8_4_ = auVar104._8_4_ * auVar104._8_4_;
    auVar49._12_4_ = auVar104._12_4_ * auVar104._12_4_;
    auVar49._16_4_ = auVar104._16_4_ * auVar104._16_4_;
    auVar49._20_4_ = auVar104._20_4_ * auVar104._20_4_;
    auVar49._24_4_ = auVar104._24_4_ * auVar104._24_4_;
    auVar49._28_4_ = auVar113._28_4_;
    auVar106 = vrsqrt14ps_avx512vl(auVar116);
    auVar25._8_4_ = 0xbf000000;
    auVar25._0_8_ = 0xbf000000bf000000;
    auVar25._12_4_ = 0xbf000000;
    auVar25._16_4_ = 0xbf000000;
    auVar25._20_4_ = 0xbf000000;
    auVar25._24_4_ = 0xbf000000;
    auVar25._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar116,auVar25);
    auVar50._4_4_ = auVar106._4_4_ * auVar104._4_4_;
    auVar50._0_4_ = auVar106._0_4_ * auVar104._0_4_;
    auVar50._8_4_ = auVar106._8_4_ * auVar104._8_4_;
    auVar50._12_4_ = auVar106._12_4_ * auVar104._12_4_;
    auVar50._16_4_ = auVar106._16_4_ * auVar104._16_4_;
    auVar50._20_4_ = auVar106._20_4_ * auVar104._20_4_;
    auVar50._24_4_ = auVar106._24_4_ * auVar104._24_4_;
    auVar50._28_4_ = auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar50);
    auVar26._8_4_ = 0x3fc00000;
    auVar26._0_8_ = 0x3fc000003fc00000;
    auVar26._12_4_ = 0x3fc00000;
    auVar26._16_4_ = 0x3fc00000;
    auVar26._20_4_ = 0x3fc00000;
    auVar26._24_4_ = 0x3fc00000;
    auVar26._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar26);
    auVar51._4_4_ = auVar101._4_4_ * auVar107._4_4_;
    auVar51._0_4_ = auVar101._0_4_ * auVar107._0_4_;
    auVar51._8_4_ = auVar101._8_4_ * auVar107._8_4_;
    auVar51._12_4_ = auVar101._12_4_ * auVar107._12_4_;
    auVar51._16_4_ = auVar101._16_4_ * auVar107._16_4_;
    auVar51._20_4_ = auVar101._20_4_ * auVar107._20_4_;
    auVar51._24_4_ = auVar101._24_4_ * auVar107._24_4_;
    auVar51._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(auVar108,auVar101);
    auVar104 = vmulps_avx512vl(local_700,auVar101);
    local_960 = ZEXT1632(auVar254);
    auVar102 = vsubps_avx512vl(auVar125,local_960);
    auVar209 = ZEXT1632(auVar92);
    auVar116 = vsubps_avx512vl(auVar125,auVar209);
    local_8c0 = ZEXT1632(auVar6);
    auVar117 = vsubps_avx512vl(auVar125,local_8c0);
    auVar118 = vmulps_avx512vl(auVar268._0_32_,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar269._0_32_,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_5c0,auVar102);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar116);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar102,auVar102);
    auVar120 = vmulps_avx512vl(auVar268._0_32_,auVar104);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar106,auVar269._0_32_);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar51,local_5c0);
    auVar104 = vmulps_avx512vl(auVar117,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar106);
    auVar121 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar51);
    auVar122 = vmulps_avx512vl(auVar120,auVar120);
    auVar106 = vsubps_avx(local_3e0,auVar122);
    auVar104 = vmulps_avx512vl(auVar120,auVar121);
    auVar104 = vsubps_avx512vl(auVar118,auVar104);
    auVar118 = vaddps_avx512vl(auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar121,auVar121);
    auVar119 = vsubps_avx512vl(auVar119,auVar104);
    auVar104 = vsubps_avx(auVar119,auVar49);
    auVar123 = vmulps_avx512vl(auVar118,auVar118);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar124 = vmulps_avx512vl(auVar105,auVar104);
    auVar124 = vsubps_avx512vl(auVar123,auVar124);
    uVar90 = vcmpps_avx512vl(auVar124,auVar125,5);
    bVar78 = (byte)uVar90;
    if (bVar78 == 0) {
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar125 = vaddps_avx512vl(auVar106,auVar106);
      auVar126 = vrcp14ps_avx512vl(auVar125);
      auVar109 = vfnmadd213ps_avx512vl(auVar125,auVar126,auVar109);
      auVar109 = vfmadd132ps_avx512vl(auVar109,auVar126,auVar126);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar125 = vxorps_avx512vl(auVar118,auVar27);
      auVar125 = vsubps_avx512vl(auVar125,auVar124);
      auVar125 = vmulps_avx512vl(auVar125,auVar109);
      auVar124 = vsubps_avx512vl(auVar124,auVar118);
      auVar109 = vmulps_avx512vl(auVar124,auVar109);
      auVar124 = vfmadd213ps_avx512vl(auVar120,auVar125,auVar121);
      local_680 = vmulps_avx512vl(auVar101,auVar124);
      auVar124 = vfmadd213ps_avx512vl(auVar120,auVar109,auVar121);
      local_6a0 = vmulps_avx512vl(auVar101,auVar124);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vblendmps_avx512vl(auVar124,auVar125);
      auVar127._0_4_ =
           (uint)(bVar78 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar78 & 1) * local_6a0._0_4_;
      bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * local_6a0._4_4_;
      bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * local_6a0._8_4_;
      bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * local_6a0._12_4_;
      bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * local_6a0._16_4_;
      bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * local_6a0._20_4_;
      bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * local_6a0._24_4_;
      bVar12 = SUB81(uVar90 >> 7,0);
      auVar127._28_4_ = (uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * local_6a0._28_4_;
      auVar223._8_4_ = 0xff800000;
      auVar223._0_8_ = 0xff800000ff800000;
      auVar223._12_4_ = 0xff800000;
      auVar223._16_4_ = 0xff800000;
      auVar223._20_4_ = 0xff800000;
      auVar223._24_4_ = 0xff800000;
      auVar223._28_4_ = 0xff800000;
      auVar124 = vblendmps_avx512vl(auVar223,auVar109);
      auVar128._0_4_ =
           (uint)(bVar78 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar109._0_4_;
      bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * auVar109._4_4_;
      bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * auVar109._8_4_;
      bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * auVar109._12_4_;
      bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * auVar109._16_4_;
      bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * auVar109._20_4_;
      bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * auVar109._24_4_;
      bVar12 = SUB81(uVar90 >> 7,0);
      auVar128._28_4_ = (uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar122,auVar109);
      auVar124 = vmaxps_avx512vl(local_5e0,auVar109);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      auVar124 = vmulps_avx512vl(auVar124,auVar28);
      vandps_avx512vl(auVar106,auVar109);
      uVar82 = vcmpps_avx512vl(auVar124,auVar124,1);
      uVar90 = uVar90 & uVar82;
      bVar85 = (byte)uVar90;
      if (bVar85 != 0) {
        uVar82 = vcmpps_avx512vl(auVar104,_DAT_02020f00,2);
        auVar237._8_4_ = 0xff800000;
        auVar237._0_8_ = 0xff800000ff800000;
        auVar237._12_4_ = 0xff800000;
        auVar237._16_4_ = 0xff800000;
        auVar237._20_4_ = 0xff800000;
        auVar237._24_4_ = 0xff800000;
        auVar237._28_4_ = 0xff800000;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar109 = vblendmps_avx512vl(auVar104,auVar237);
        bVar81 = (byte)uVar82;
        uVar91 = (uint)(bVar81 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar124._0_4_;
        bVar12 = (bool)((byte)(uVar82 >> 1) & 1);
        uVar146 = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar124._4_4_;
        bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
        uVar147 = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar124._8_4_;
        bVar12 = (bool)((byte)(uVar82 >> 3) & 1);
        uVar148 = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar124._12_4_;
        bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
        uVar149 = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * auVar124._16_4_;
        bVar12 = (bool)((byte)(uVar82 >> 5) & 1);
        uVar150 = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * auVar124._20_4_;
        bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
        uVar151 = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * auVar124._24_4_;
        bVar12 = SUB81(uVar82 >> 7,0);
        uVar152 = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * auVar124._28_4_;
        auVar127._0_4_ = (bVar85 & 1) * uVar91 | !(bool)(bVar85 & 1) * auVar127._0_4_;
        bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar127._4_4_ = bVar12 * uVar146 | !bVar12 * auVar127._4_4_;
        bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar127._8_4_ = bVar12 * uVar147 | !bVar12 * auVar127._8_4_;
        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar127._12_4_ = bVar12 * uVar148 | !bVar12 * auVar127._12_4_;
        bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar127._16_4_ = bVar12 * uVar149 | !bVar12 * auVar127._16_4_;
        bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar127._20_4_ = bVar12 * uVar150 | !bVar12 * auVar127._20_4_;
        bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar127._24_4_ = bVar12 * uVar151 | !bVar12 * auVar127._24_4_;
        bVar12 = SUB81(uVar90 >> 7,0);
        auVar127._28_4_ = bVar12 * uVar152 | !bVar12 * auVar127._28_4_;
        auVar104 = vblendmps_avx512vl(auVar237,auVar104);
        bVar12 = (bool)((byte)(uVar82 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar82 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar82 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
        bVar18 = SUB81(uVar82 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar85 & 1) *
             ((uint)(bVar81 & 1) * auVar104._0_4_ | !(bool)(bVar81 & 1) * uVar91) |
             !(bool)(bVar85 & 1) * auVar128._0_4_;
        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar89 * ((uint)bVar12 * auVar104._4_4_ | !bVar12 * uVar146) |
             !bVar89 * auVar128._4_4_;
        bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar12 * ((uint)bVar13 * auVar104._8_4_ | !bVar13 * uVar147) |
             !bVar12 * auVar128._8_4_;
        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar104._12_4_ | !bVar14 * uVar148) |
             !bVar12 * auVar128._12_4_;
        bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar104._16_4_ | !bVar15 * uVar149) |
             !bVar12 * auVar128._16_4_;
        bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar104._20_4_ | !bVar16 * uVar150) |
             !bVar12 * auVar128._20_4_;
        bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar104._24_4_ | !bVar17 * uVar151) |
             !bVar12 * auVar128._24_4_;
        bVar12 = SUB81(uVar90 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar104._28_4_ | !bVar18 * uVar152) |
             !bVar12 * auVar128._28_4_;
        bVar78 = (~bVar85 | bVar81) & bVar78;
      }
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar266 = ZEXT3264(auVar109);
    if ((bVar78 & 0x7f) == 0) {
      auVar269 = ZEXT3264(local_8e0);
      auVar268 = ZEXT3264(local_900);
    }
    else {
      fVar153 = *(float *)(ray + k * 4 + 0x100) - (float)local_7a0._0_4_;
      auVar224._4_4_ = fVar153;
      auVar224._0_4_ = fVar153;
      auVar224._8_4_ = fVar153;
      auVar224._12_4_ = fVar153;
      auVar224._16_4_ = fVar153;
      auVar224._20_4_ = fVar153;
      auVar224._24_4_ = fVar153;
      auVar224._28_4_ = fVar153;
      auVar124 = vminps_avx512vl(auVar224,auVar128);
      auVar73._4_4_ = fStack_3fc;
      auVar73._0_4_ = local_400;
      auVar73._8_4_ = fStack_3f8;
      auVar73._12_4_ = fStack_3f4;
      auVar73._16_4_ = fStack_3f0;
      auVar73._20_4_ = fStack_3ec;
      auVar73._24_4_ = fStack_3e8;
      auVar73._28_4_ = fStack_3e4;
      auVar104 = vmaxps_avx512vl(auVar73,auVar127);
      auVar117 = vmulps_avx512vl(auVar263,auVar117);
      auVar116 = vfmadd213ps_avx512vl(auVar116,auVar259,auVar117);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar47,auVar116);
      auVar268 = ZEXT3264(local_900);
      auVar116 = vmulps_avx512vl(local_900,auVar263);
      auVar269 = ZEXT3264(local_8e0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_8e0,auVar259);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_5c0,auVar47);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar116,auVar117);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar117,auVar125,1);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar102 = vxorps_avx512vl(auVar102,auVar126);
      auVar129 = vrcp14ps_avx512vl(auVar116);
      auVar130 = vxorps_avx512vl(auVar116,auVar126);
      auVar131 = vfnmadd213ps_avx512vl(auVar129,auVar116,auVar109);
      auVar131 = vfmadd132ps_avx512vl(auVar131,auVar129,auVar129);
      auVar102 = vmulps_avx512vl(auVar131,auVar102);
      uVar22 = vcmpps_avx512vl(auVar116,auVar130,1);
      bVar85 = (byte)uVar20 | (byte)uVar22;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar132 = vblendmps_avx512vl(auVar102,auVar131);
      auVar133._0_4_ =
           (uint)(bVar85 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar129._0_4_;
      bVar12 = (bool)(bVar85 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar12 * auVar132._4_4_ | (uint)!bVar12 * auVar129._4_4_;
      bVar12 = (bool)(bVar85 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar12 * auVar132._8_4_ | (uint)!bVar12 * auVar129._8_4_;
      bVar12 = (bool)(bVar85 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar12 * auVar132._12_4_ | (uint)!bVar12 * auVar129._12_4_;
      bVar12 = (bool)(bVar85 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar12 * auVar132._16_4_ | (uint)!bVar12 * auVar129._16_4_;
      bVar12 = (bool)(bVar85 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar12 * auVar132._20_4_ | (uint)!bVar12 * auVar129._20_4_;
      bVar12 = (bool)(bVar85 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar12 * auVar132._24_4_ | (uint)!bVar12 * auVar129._24_4_;
      auVar133._28_4_ =
           (uint)(bVar85 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar85 >> 7) * auVar129._28_4_;
      auVar104 = vmaxps_avx(auVar104,auVar133);
      uVar22 = vcmpps_avx512vl(auVar116,auVar130,6);
      bVar85 = (byte)uVar20 | (byte)uVar22;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar134._0_4_ =
           (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar102._0_4_;
      bVar12 = (bool)(bVar85 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar102._4_4_;
      bVar12 = (bool)(bVar85 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar102._8_4_;
      bVar12 = (bool)(bVar85 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar102._12_4_;
      bVar12 = (bool)(bVar85 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * auVar102._16_4_;
      bVar12 = (bool)(bVar85 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * auVar102._20_4_;
      bVar12 = (bool)(bVar85 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * auVar102._24_4_;
      auVar134._28_4_ =
           (uint)(bVar85 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar85 >> 7) * auVar102._28_4_;
      auVar102 = vminps_avx(auVar124,auVar134);
      auVar265 = ZEXT864(0) << 0x20;
      auVar110 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,auVar111);
      auVar124 = ZEXT832(0) << 0x20;
      auVar112 = vsubps_avx(auVar124,auVar112);
      auVar52._4_4_ = auVar112._4_4_ * auVar115._4_4_;
      auVar52._0_4_ = auVar112._0_4_ * auVar115._0_4_;
      auVar52._8_4_ = auVar112._8_4_ * auVar115._8_4_;
      auVar52._12_4_ = auVar112._12_4_ * auVar115._12_4_;
      auVar52._16_4_ = auVar112._16_4_ * auVar115._16_4_;
      auVar52._20_4_ = auVar112._20_4_ * auVar115._20_4_;
      auVar52._24_4_ = auVar112._24_4_ * auVar115._24_4_;
      auVar52._28_4_ = auVar112._28_4_;
      auVar111 = vfnmsub231ps_avx512vl(auVar52,auVar114,auVar111);
      auVar110 = vfnmadd231ps_avx512vl(auVar111,auVar103,auVar110);
      auVar111 = vmulps_avx512vl(local_900,auVar115);
      auVar111 = vfnmsub231ps_avx512vl(auVar111,local_8e0,auVar114);
      auVar111 = vfnmadd231ps_avx512vl(auVar111,local_5c0,auVar103);
      vandps_avx512vl(auVar111,auVar117);
      uVar20 = vcmpps_avx512vl(auVar111,auVar125,1);
      auVar110 = vxorps_avx512vl(auVar110,auVar126);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar103 = vxorps_avx512vl(auVar111,auVar126);
      auVar115 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar109);
      auVar95 = vfmadd132ps_fma(auVar115,auVar112,auVar112);
      auVar260 = ZEXT1664(auVar95);
      fVar153 = auVar95._0_4_ * auVar110._0_4_;
      fVar241 = auVar95._4_4_ * auVar110._4_4_;
      auVar53._4_4_ = fVar241;
      auVar53._0_4_ = fVar153;
      fVar242 = auVar95._8_4_ * auVar110._8_4_;
      auVar53._8_4_ = fVar242;
      fVar243 = auVar95._12_4_ * auVar110._12_4_;
      auVar53._12_4_ = fVar243;
      fVar250 = auVar110._16_4_ * 0.0;
      auVar53._16_4_ = fVar250;
      fVar251 = auVar110._20_4_ * 0.0;
      auVar53._20_4_ = fVar251;
      fVar252 = auVar110._24_4_ * 0.0;
      auVar53._24_4_ = fVar252;
      auVar53._28_4_ = auVar110._28_4_;
      uVar22 = vcmpps_avx512vl(auVar111,auVar103,1);
      bVar85 = (byte)uVar20 | (byte)uVar22;
      auVar115 = vblendmps_avx512vl(auVar53,auVar131);
      auVar135._0_4_ =
           (uint)(bVar85 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar112._0_4_;
      bVar12 = (bool)(bVar85 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar112._4_4_;
      bVar12 = (bool)(bVar85 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar112._8_4_;
      bVar12 = (bool)(bVar85 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar112._12_4_;
      bVar12 = (bool)(bVar85 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * auVar112._16_4_;
      bVar12 = (bool)(bVar85 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * auVar112._20_4_;
      bVar12 = (bool)(bVar85 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * auVar112._24_4_;
      auVar135._28_4_ =
           (uint)(bVar85 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar85 >> 7) * auVar112._28_4_;
      auVar255 = ZEXT3264(auVar135);
      _local_740 = vmaxps_avx(auVar104,auVar135);
      uVar22 = vcmpps_avx512vl(auVar111,auVar103,6);
      bVar85 = (byte)uVar20 | (byte)uVar22;
      auVar136._0_4_ =
           (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * (int)fVar153;
      bVar12 = (bool)(bVar85 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * (int)fVar241;
      bVar12 = (bool)(bVar85 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * (int)fVar242;
      bVar12 = (bool)(bVar85 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * (int)fVar243;
      bVar12 = (bool)(bVar85 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * (int)fVar250;
      bVar12 = (bool)(bVar85 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * (int)fVar251;
      bVar12 = (bool)(bVar85 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * (int)fVar252;
      auVar136._28_4_ =
           (uint)(bVar85 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar85 >> 7) * auVar110._28_4_;
      auVar249 = ZEXT3264(auVar136);
      local_460 = vminps_avx(auVar102,auVar136);
      auVar248 = ZEXT3264(local_460);
      uVar20 = vcmpps_avx512vl(_local_740,local_460,2);
      bVar78 = bVar78 & 0x7f & (byte)uVar20;
      if (bVar78 != 0) {
        auVar104 = vmaxps_avx(auVar124,auVar113);
        auVar110 = vminps_avx512vl(local_680,auVar109);
        auVar58 = ZEXT412(0);
        auVar255 = ZEXT1264(auVar58) << 0x20;
        auVar110 = vmaxps_avx(auVar110,ZEXT1232(auVar58) << 0x20);
        auVar111 = vminps_avx512vl(local_6a0,auVar109);
        auVar260 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar54._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar110._28_4_ + 7.0;
        auVar95 = vfmadd213ps_fma(auVar54,local_8a0,auVar233);
        local_680 = ZEXT1632(auVar95);
        auVar110 = vmaxps_avx(auVar111,ZEXT1232(auVar58) << 0x20);
        auVar55._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar110._28_4_ + 7.0;
        auVar95 = vfmadd213ps_fma(auVar55,local_8a0,auVar233);
        local_6a0 = ZEXT1632(auVar95);
        auVar225._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar225._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar225._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar225._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar225._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar225._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar225._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar225._28_4_ = 0;
        auVar104 = vsubps_avx(auVar119,auVar225);
        auVar105 = vmulps_avx512vl(auVar105,auVar104);
        auVar105 = vsubps_avx512vl(auVar123,auVar105);
        uVar20 = vcmpps_avx512vl(auVar105,ZEXT1232(auVar58) << 0x20,5);
        bVar85 = (byte)uVar20;
        if (bVar85 == 0) {
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar109 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar249 = ZEXT864(0) << 0x20;
          auVar137._8_4_ = 0x7f800000;
          auVar137._0_8_ = 0x7f8000007f800000;
          auVar137._12_4_ = 0x7f800000;
          auVar137._16_4_ = 0x7f800000;
          auVar137._20_4_ = 0x7f800000;
          auVar137._24_4_ = 0x7f800000;
          auVar137._28_4_ = 0x7f800000;
          auVar138._8_4_ = 0xff800000;
          auVar138._0_8_ = 0xff800000ff800000;
          auVar138._12_4_ = 0xff800000;
          auVar138._16_4_ = 0xff800000;
          auVar138._20_4_ = 0xff800000;
          auVar138._24_4_ = 0xff800000;
          auVar138._28_4_ = 0xff800000;
        }
        else {
          auVar92 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
          uVar90 = vcmpps_avx512vl(auVar105,auVar124,5);
          auVar105 = vsqrtps_avx(auVar105);
          auVar236._0_4_ = auVar106._0_4_ + auVar106._0_4_;
          auVar236._4_4_ = auVar106._4_4_ + auVar106._4_4_;
          auVar236._8_4_ = auVar106._8_4_ + auVar106._8_4_;
          auVar236._12_4_ = auVar106._12_4_ + auVar106._12_4_;
          auVar236._16_4_ = auVar106._16_4_ + auVar106._16_4_;
          auVar236._20_4_ = auVar106._20_4_ + auVar106._20_4_;
          auVar236._24_4_ = auVar106._24_4_ + auVar106._24_4_;
          auVar236._28_4_ = auVar106._28_4_ + auVar106._28_4_;
          auVar110 = vrcp14ps_avx512vl(auVar236);
          auVar109 = vfnmadd213ps_avx512vl(auVar236,auVar110,auVar109);
          auVar95 = vfmadd132ps_fma(auVar109,auVar110,auVar110);
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar29._16_4_ = 0x80000000;
          auVar29._20_4_ = 0x80000000;
          auVar29._24_4_ = 0x80000000;
          auVar29._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar118,auVar29);
          auVar109 = vsubps_avx(auVar109,auVar105);
          auVar56._4_4_ = auVar109._4_4_ * auVar95._4_4_;
          auVar56._0_4_ = auVar109._0_4_ * auVar95._0_4_;
          auVar56._8_4_ = auVar109._8_4_ * auVar95._8_4_;
          auVar56._12_4_ = auVar109._12_4_ * auVar95._12_4_;
          auVar56._16_4_ = auVar109._16_4_ * 0.0;
          auVar56._20_4_ = auVar109._20_4_ * 0.0;
          auVar56._24_4_ = auVar109._24_4_ * 0.0;
          auVar56._28_4_ = 0x3e000000;
          auVar105 = vsubps_avx512vl(auVar105,auVar118);
          auVar264._0_4_ = auVar105._0_4_ * auVar95._0_4_;
          auVar264._4_4_ = auVar105._4_4_ * auVar95._4_4_;
          auVar264._8_4_ = auVar105._8_4_ * auVar95._8_4_;
          auVar264._12_4_ = auVar105._12_4_ * auVar95._12_4_;
          auVar264._16_4_ = auVar105._16_4_ * 0.0;
          auVar264._20_4_ = auVar105._20_4_ * 0.0;
          auVar264._24_4_ = auVar105._24_4_ * 0.0;
          auVar264._28_4_ = 0;
          auVar265 = ZEXT3264(auVar264);
          auVar105 = vfmadd213ps_avx512vl(auVar120,auVar56,auVar121);
          auVar57._4_4_ = auVar101._4_4_ * auVar105._4_4_;
          auVar57._0_4_ = auVar101._0_4_ * auVar105._0_4_;
          auVar57._8_4_ = auVar101._8_4_ * auVar105._8_4_;
          auVar57._12_4_ = auVar101._12_4_ * auVar105._12_4_;
          auVar57._16_4_ = auVar101._16_4_ * auVar105._16_4_;
          auVar57._20_4_ = auVar101._20_4_ * auVar105._20_4_;
          auVar57._24_4_ = auVar101._24_4_ * auVar105._24_4_;
          auVar57._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(local_5c0,auVar56);
          auVar105 = vmulps_avx512vl(local_8e0,auVar56);
          auVar110 = vmulps_avx512vl(local_900,auVar56);
          auVar111 = vfmadd213ps_avx512vl(auVar107,auVar57,local_960);
          auVar109 = vsubps_avx512vl(auVar109,auVar111);
          auVar111 = vfmadd213ps_avx512vl(auVar108,auVar57,auVar209);
          auVar105 = vsubps_avx512vl(auVar105,auVar111);
          auVar95 = vfmadd213ps_fma(auVar57,local_700,local_8c0);
          auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar95));
          auVar249 = ZEXT3264(auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar120,auVar264,auVar121);
          auVar110 = vmulps_avx512vl(auVar101,auVar110);
          auVar111 = vmulps_avx512vl(local_5c0,auVar264);
          auVar112 = vmulps_avx512vl(local_8e0,auVar264);
          auVar113 = vmulps_avx512vl(local_900,auVar264);
          auVar95 = vfmadd213ps_fma(auVar107,auVar110,local_960);
          auVar107 = vsubps_avx(auVar111,ZEXT1632(auVar95));
          auVar255 = ZEXT3264(auVar107);
          auVar95 = vfmadd213ps_fma(auVar108,auVar110,auVar209);
          auVar107 = vsubps_avx512vl(auVar112,ZEXT1632(auVar95));
          auVar95 = vfmadd213ps_fma(local_700,auVar110,local_8c0);
          auVar108 = vsubps_avx512vl(auVar113,ZEXT1632(auVar95));
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar110 = vblendmps_avx512vl(auVar164,auVar56);
          bVar12 = (bool)((byte)uVar90 & 1);
          auVar137._0_4_ = (uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * auVar254._0_4_;
          bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar254._4_4_;
          bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar254._8_4_;
          bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar254._12_4_;
          iVar1 = (uint)((byte)(uVar90 >> 4) & 1) * auVar110._16_4_;
          auVar137._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar90 >> 5) & 1) * auVar110._20_4_;
          auVar137._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar90 >> 6) & 1) * auVar110._24_4_;
          auVar137._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar90 >> 7) * auVar110._28_4_;
          auVar137._28_4_ = iVar4;
          auVar165._8_4_ = 0xff800000;
          auVar165._0_8_ = 0xff800000ff800000;
          auVar165._12_4_ = 0xff800000;
          auVar165._16_4_ = 0xff800000;
          auVar165._20_4_ = 0xff800000;
          auVar165._24_4_ = 0xff800000;
          auVar165._28_4_ = 0xff800000;
          auVar110 = vblendmps_avx512vl(auVar165,auVar264);
          bVar12 = (bool)((byte)uVar90 & 1);
          auVar138._0_4_ = (uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
          auVar138._16_4_ = (uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
          auVar138._20_4_ = (uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
          auVar138._24_4_ = (uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = SUB81(uVar90 >> 7,0);
          auVar138._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * -0x800000;
          auVar245._8_4_ = 0x7fffffff;
          auVar245._0_8_ = 0x7fffffff7fffffff;
          auVar245._12_4_ = 0x7fffffff;
          auVar245._16_4_ = 0x7fffffff;
          auVar245._20_4_ = 0x7fffffff;
          auVar245._24_4_ = 0x7fffffff;
          auVar245._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar122,auVar245);
          auVar260 = ZEXT3264(local_5e0);
          auVar110 = vmaxps_avx(local_5e0,auVar138);
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar110 = vmulps_avx512vl(auVar110,auVar30);
          auVar106 = vandps_avx(auVar106,auVar245);
          uVar82 = vcmpps_avx512vl(auVar106,auVar110,1);
          uVar90 = uVar90 & uVar82;
          bVar81 = (byte)uVar90;
          if (bVar81 != 0) {
            uVar82 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar92),2);
            auVar246._8_4_ = 0xff800000;
            auVar246._0_8_ = 0xff800000ff800000;
            auVar246._12_4_ = 0xff800000;
            auVar246._16_4_ = 0xff800000;
            auVar246._20_4_ = 0xff800000;
            auVar246._24_4_ = 0xff800000;
            auVar246._28_4_ = 0xff800000;
            auVar257._8_4_ = 0x7f800000;
            auVar257._0_8_ = 0x7f8000007f800000;
            auVar257._12_4_ = 0x7f800000;
            auVar257._16_4_ = 0x7f800000;
            auVar257._20_4_ = 0x7f800000;
            auVar257._24_4_ = 0x7f800000;
            auVar257._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar257,auVar246);
            bVar84 = (byte)uVar82;
            uVar91 = (uint)(bVar84 & 1) * auVar106._0_4_ |
                     (uint)!(bool)(bVar84 & 1) * auVar110._0_4_;
            bVar12 = (bool)((byte)(uVar82 >> 1) & 1);
            uVar146 = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar110._4_4_;
            bVar12 = (bool)((byte)(uVar82 >> 2) & 1);
            uVar147 = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar110._8_4_;
            bVar12 = (bool)((byte)(uVar82 >> 3) & 1);
            uVar148 = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar110._12_4_;
            bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
            uVar149 = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar110._16_4_;
            bVar12 = (bool)((byte)(uVar82 >> 5) & 1);
            uVar150 = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar110._20_4_;
            bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
            uVar151 = (uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar110._24_4_;
            bVar12 = SUB81(uVar82 >> 7,0);
            uVar152 = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar110._28_4_;
            auVar137._0_4_ = (bVar81 & 1) * uVar91 | !(bool)(bVar81 & 1) * auVar137._0_4_;
            bVar12 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar137._4_4_ = bVar12 * uVar146 | !bVar12 * auVar137._4_4_;
            bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar137._8_4_ = bVar12 * uVar147 | !bVar12 * auVar137._8_4_;
            bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar137._12_4_ = bVar12 * uVar148 | !bVar12 * auVar137._12_4_;
            bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar137._16_4_ = bVar12 * uVar149 | (uint)!bVar12 * iVar1;
            bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar137._20_4_ = bVar12 * uVar150 | (uint)!bVar12 * iVar2;
            bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar137._24_4_ = bVar12 * uVar151 | (uint)!bVar12 * iVar3;
            bVar12 = SUB81(uVar90 >> 7,0);
            auVar137._28_4_ = bVar12 * uVar152 | (uint)!bVar12 * iVar4;
            auVar106 = vblendmps_avx512vl(auVar246,auVar257);
            bVar12 = (bool)((byte)(uVar82 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar82 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar82 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
            bVar18 = SUB81(uVar82 >> 7,0);
            auVar138._0_4_ =
                 (uint)(bVar81 & 1) *
                 ((uint)(bVar84 & 1) * auVar106._0_4_ | !(bool)(bVar84 & 1) * uVar91) |
                 !(bool)(bVar81 & 1) * auVar138._0_4_;
            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar138._4_4_ =
                 (uint)bVar89 * ((uint)bVar12 * auVar106._4_4_ | !bVar12 * uVar146) |
                 !bVar89 * auVar138._4_4_;
            bVar12 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar138._8_4_ =
                 (uint)bVar12 * ((uint)bVar13 * auVar106._8_4_ | !bVar13 * uVar147) |
                 !bVar12 * auVar138._8_4_;
            bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar138._12_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar106._12_4_ | !bVar14 * uVar148) |
                 !bVar12 * auVar138._12_4_;
            bVar12 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar138._16_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar106._16_4_ | !bVar15 * uVar149) |
                 !bVar12 * auVar138._16_4_;
            bVar12 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar138._20_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar106._20_4_ | !bVar16 * uVar150) |
                 !bVar12 * auVar138._20_4_;
            bVar12 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar138._24_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar106._24_4_ | !bVar17 * uVar151) |
                 !bVar12 * auVar138._24_4_;
            bVar12 = SUB81(uVar90 >> 7,0);
            auVar138._28_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar106._28_4_ | !bVar18 * uVar152) |
                 !bVar12 * auVar138._28_4_;
            bVar85 = (~bVar81 | bVar84) & bVar85;
          }
        }
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar106 = vmulps_avx512vl(local_900,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_8e0,auVar107);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_5c0,auVar255._0_32_);
        _local_1c0 = _local_740;
        local_1a0 = vminps_avx(local_460,auVar137);
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar106,auVar240);
        _local_6e0 = vmaxps_avx(_local_740,auVar138);
        auVar239 = ZEXT3264(_local_6e0);
        _local_480 = _local_6e0;
        auVar166._8_4_ = 0x3e99999a;
        auVar166._0_8_ = 0x3e99999a3e99999a;
        auVar166._12_4_ = 0x3e99999a;
        auVar166._16_4_ = 0x3e99999a;
        auVar166._20_4_ = 0x3e99999a;
        auVar166._24_4_ = 0x3e99999a;
        auVar166._28_4_ = 0x3e99999a;
        uVar20 = vcmpps_avx512vl(auVar106,auVar166,1);
        uVar22 = vcmpps_avx512vl(_local_740,local_1a0,2);
        bVar81 = (byte)uVar22 & bVar78;
        uVar21 = vcmpps_avx512vl(_local_6e0,local_460,2);
        if ((bVar78 & ((byte)uVar21 | (byte)uVar22)) == 0) {
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar266 = ZEXT3264(auVar106);
        }
        else {
          auVar106 = vmulps_avx512vl(local_900,auVar249._0_32_);
          auVar106 = vfmadd213ps_avx512vl(auVar105,local_8e0,auVar106);
          auVar106 = vfmadd213ps_avx512vl(auVar109,local_5c0,auVar106);
          auVar106 = vandps_avx(auVar106,auVar240);
          uVar22 = vcmpps_avx512vl(auVar106,auVar166,1);
          bVar84 = (byte)uVar22 | ~bVar85;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar106 = vpblendmd_avx512vl(auVar167,auVar31);
          local_440._0_4_ = (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
          bVar12 = (bool)(bVar84 >> 1 & 1);
          local_440._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 2 & 1);
          local_440._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 3 & 1);
          local_440._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 4 & 1);
          local_440._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 5 & 1);
          local_440._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar84 >> 6 & 1);
          local_440._24_4_ = (uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * 2;
          local_440._28_4_ = (uint)(bVar84 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2;
          local_600 = vpbroadcastd_avx512vl();
          uVar22 = vpcmpd_avx512vl(local_600,local_440,5);
          bVar84 = (byte)uVar22 & bVar81;
          if (bVar84 != 0) {
            auVar254 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar95 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar92 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar6 = vminps_avx(auVar254,auVar92);
            auVar254 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar92 = vmaxps_avx(auVar95,auVar254);
            auVar95 = vandps_avx(auVar256,auVar6);
            auVar254 = vandps_avx(auVar256,auVar92);
            auVar95 = vmaxps_avx(auVar95,auVar254);
            auVar254 = vmovshdup_avx(auVar95);
            auVar254 = vmaxss_avx(auVar254,auVar95);
            auVar95 = vshufpd_avx(auVar95,auVar95,1);
            auVar95 = vmaxss_avx(auVar95,auVar254);
            fVar153 = auVar95._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar92,auVar92,0xff);
            local_6c0 = (float)local_740._0_4_ + (float)local_720._0_4_;
            fStack_6bc = (float)local_740._4_4_ + (float)local_720._4_4_;
            fStack_6b8 = fStack_738 + fStack_718;
            fStack_6b4 = fStack_734 + fStack_714;
            fStack_6b0 = fStack_730 + fStack_710;
            fStack_6ac = fStack_72c + fStack_70c;
            fStack_6a8 = fStack_728 + fStack_708;
            fStack_6a4 = fStack_724 + fStack_704;
            do {
              auVar168._8_4_ = 0x7f800000;
              auVar168._0_8_ = 0x7f8000007f800000;
              auVar168._12_4_ = 0x7f800000;
              auVar168._16_4_ = 0x7f800000;
              auVar168._20_4_ = 0x7f800000;
              auVar168._24_4_ = 0x7f800000;
              auVar168._28_4_ = 0x7f800000;
              auVar106 = vblendmps_avx512vl(auVar168,_local_740);
              auVar139._0_4_ =
                   (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 1 & 1);
              auVar139._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 2 & 1);
              auVar139._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 3 & 1);
              auVar139._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 4 & 1);
              auVar139._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar84 >> 5 & 1);
              auVar139._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar139._24_4_ =
                   (uint)(bVar84 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar106 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar106 = vminps_avx(auVar139,auVar106);
              auVar104 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar104);
              auVar104 = vpermpd_avx2(auVar106,0x4e);
              auVar106 = vminps_avx(auVar106,auVar104);
              uVar22 = vcmpps_avx512vl(auVar139,auVar106,0);
              bVar79 = (byte)uVar22 & bVar84;
              bVar80 = bVar84;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              iVar2 = 0;
              for (uVar91 = (uint)bVar80; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar91 = *(uint *)(local_680 + (uint)(iVar2 << 2));
              uVar146 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar241 = auVar19._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_880._0_4_);
              }
              auVar255 = ZEXT464(uVar91);
              auVar248 = ZEXT464(uVar146);
              lVar88 = 4;
              do {
                fVar242 = auVar248._0_4_;
                auVar156._4_4_ = fVar242;
                auVar156._0_4_ = fVar242;
                auVar156._8_4_ = fVar242;
                auVar156._12_4_ = fVar242;
                auVar95 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_870);
                fVar253 = auVar255._0_4_;
                fVar238 = 1.0 - fVar253;
                fVar251 = fVar238 * fVar238 * fVar238;
                fVar243 = fVar253 * fVar253;
                fVar244 = fVar253 * fVar243;
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                           ZEXT416((uint)fVar244));
                fVar250 = fVar253 * fVar238;
                auVar93 = ZEXT416((uint)fVar238);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar250 * 6.0)),
                                         ZEXT416((uint)(fVar250 * fVar238)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                          ZEXT416((uint)fVar251));
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar238 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar253 * fVar250)));
                fVar251 = fVar251 * 0.16666667;
                fVar252 = (auVar254._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar217 = (auVar92._0_4_ + auVar96._0_4_) * 0.16666667;
                fVar244 = fVar244 * 0.16666667;
                auVar199._0_4_ = fVar244 * (float)local_860._0_4_;
                auVar199._4_4_ = fVar244 * (float)local_860._4_4_;
                auVar199._8_4_ = fVar244 * fStack_858;
                auVar199._12_4_ = fVar244 * fStack_854;
                auVar229._4_4_ = fVar217;
                auVar229._0_4_ = fVar217;
                auVar229._8_4_ = fVar217;
                auVar229._12_4_ = fVar217;
                auVar254 = vfmadd132ps_fma(auVar229,auVar199,local_820._0_16_);
                auVar200._4_4_ = fVar252;
                auVar200._0_4_ = fVar252;
                auVar200._8_4_ = fVar252;
                auVar200._12_4_ = fVar252;
                auVar254 = vfmadd132ps_fma(auVar200,auVar254,local_840._0_16_);
                auVar179._4_4_ = fVar251;
                auVar179._0_4_ = fVar251;
                auVar179._8_4_ = fVar251;
                auVar179._12_4_ = fVar251;
                auVar254 = vfmadd132ps_fma(auVar179,auVar254,local_800._0_16_);
                local_700._0_16_ = auVar254;
                auVar95 = vsubps_avx(auVar95,auVar254);
                local_8a0._0_16_ = auVar95;
                auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
                auVar254 = auVar255._0_16_;
                local_8c0._0_16_ = auVar95;
                if (auVar95._0_4_ < 0.0) {
                  local_960._0_4_ = fVar243;
                  auVar260._0_4_ = sqrtf(auVar95._0_4_);
                  auVar260._4_60_ = extraout_var;
                  auVar95 = auVar260._0_16_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  local_960._0_4_ = fVar243;
                }
                auVar6 = vfnmsub213ss_fma(auVar254,auVar254,ZEXT416((uint)(fVar250 * 4.0)));
                auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),auVar93,auVar93);
                fVar243 = fVar238 * -fVar238 * 0.5;
                fVar250 = auVar6._0_4_ * 0.5;
                fVar251 = auVar92._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar219._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar219._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar219._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar219._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar180._4_4_ = fVar251;
                auVar180._0_4_ = fVar251;
                auVar180._8_4_ = fVar251;
                auVar180._12_4_ = fVar251;
                auVar92 = vfmadd132ps_fma(auVar180,auVar219,local_820._0_16_);
                auVar201._4_4_ = fVar250;
                auVar201._0_4_ = fVar250;
                auVar201._8_4_ = fVar250;
                auVar201._12_4_ = fVar250;
                auVar92 = vfmadd132ps_fma(auVar201,auVar92,local_840._0_16_);
                auVar261._4_4_ = fVar243;
                auVar261._0_4_ = fVar243;
                auVar261._8_4_ = fVar243;
                auVar261._12_4_ = fVar243;
                local_960._0_16_ = vfmadd132ps_fma(auVar261,auVar92,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar243 = local_760._0_4_;
                auVar92 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar243));
                fVar250 = auVar92._0_4_;
                local_770 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar243));
                auVar92 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar91 = auVar95._0_4_;
                local_750 = fVar238;
                fStack_74c = fVar238;
                fStack_748 = fVar238;
                fStack_744 = fVar238;
                if (fVar243 < -fVar243) {
                  auVar265._0_4_ = sqrtf(fVar243);
                  auVar265._4_60_ = extraout_var_00;
                  auVar95 = ZEXT416(uVar91);
                  auVar96 = auVar265._0_16_;
                  auVar6 = local_960._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx512f(local_760,local_760);
                  auVar6 = local_960._0_16_;
                }
                fVar243 = fVar250 * 1.5 + fVar243 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar157._0_4_ = auVar6._0_4_ * fVar243;
                auVar157._4_4_ = auVar6._4_4_ * fVar243;
                auVar157._8_4_ = auVar6._8_4_ * fVar243;
                auVar157._12_4_ = auVar6._12_4_ * fVar243;
                auVar267 = vdpps_avx(local_8a0._0_16_,auVar157,0x7f);
                fVar252 = auVar95._0_4_;
                fVar250 = auVar267._0_4_;
                auVar158._0_4_ = fVar250 * fVar250;
                auVar158._4_4_ = auVar267._4_4_ * auVar267._4_4_;
                auVar158._8_4_ = auVar267._8_4_ * auVar267._8_4_;
                auVar158._12_4_ = auVar267._12_4_ * auVar267._12_4_;
                auVar97 = vsubps_avx512vl(local_8c0._0_16_,auVar158);
                fVar251 = auVar97._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar251;
                auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar99 = vmulss_avx512f(auVar98,ZEXT416(0x3fc00000));
                auVar100 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                if (fVar251 < 0.0) {
                  local_790 = fVar243;
                  fStack_78c = fVar243;
                  fStack_788 = fVar243;
                  fStack_784 = fVar243;
                  local_780 = auVar98;
                  fVar251 = sqrtf(fVar251);
                  auVar100 = ZEXT416(auVar100._0_4_);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar95 = ZEXT416(uVar91);
                  auVar6 = local_960._0_16_;
                  auVar98 = local_780;
                  fVar243 = local_790;
                  fVar217 = fStack_78c;
                  fVar244 = fStack_788;
                  fVar238 = fStack_784;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar251 = auVar97._0_4_;
                  fVar217 = fVar243;
                  fVar244 = fVar243;
                  fVar238 = fVar243;
                }
                auVar265 = ZEXT1664(auVar6);
                auVar249 = ZEXT1664(local_8a0._0_16_);
                auVar256._8_4_ = 0x7fffffff;
                auVar256._0_8_ = 0x7fffffff7fffffff;
                auVar256._12_4_ = 0x7fffffff;
                auVar269 = ZEXT3264(local_8e0);
                auVar268 = ZEXT3264(local_900);
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar93,auVar254);
                auVar254 = vfmadd231ss_fma(auVar93,auVar254,SUB6416(ZEXT464(0xc0000000),0));
                auVar202._0_4_ = fVar253 * (float)local_860._0_4_;
                auVar202._4_4_ = fVar253 * (float)local_860._4_4_;
                auVar202._8_4_ = fVar253 * fStack_858;
                auVar202._12_4_ = fVar253 * fStack_854;
                auVar220._0_4_ = auVar254._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar254 = vfmadd132ps_fma(auVar220,auVar202,local_820._0_16_);
                auVar182._0_4_ = auVar97._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar254 = vfmadd132ps_fma(auVar182,auVar254,local_840._0_16_);
                auVar69._4_4_ = fStack_74c;
                auVar69._0_4_ = local_750;
                auVar69._8_4_ = fStack_748;
                auVar69._12_4_ = fStack_744;
                auVar254 = vfmadd132ps_fma(auVar69,auVar254,local_800._0_16_);
                auVar183._0_4_ = auVar254._0_4_ * (float)local_760._0_4_;
                auVar183._4_4_ = auVar254._4_4_ * (float)local_760._0_4_;
                auVar183._8_4_ = auVar254._8_4_ * (float)local_760._0_4_;
                auVar183._12_4_ = auVar254._12_4_ * (float)local_760._0_4_;
                auVar254 = vdpps_avx(auVar6,auVar254,0x7f);
                fVar198 = auVar254._0_4_;
                auVar203._0_4_ = auVar6._0_4_ * fVar198;
                auVar203._4_4_ = auVar6._4_4_ * fVar198;
                auVar203._8_4_ = auVar6._8_4_ * fVar198;
                auVar203._12_4_ = auVar6._12_4_ * fVar198;
                auVar254 = vsubps_avx(auVar183,auVar203);
                fVar198 = auVar92._0_4_ * (float)local_770._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar141._16_16_ = local_900._16_16_;
                auVar97 = vxorps_avx512vl(auVar6,auVar23);
                auVar230._0_4_ = fVar243 * auVar254._0_4_ * fVar198;
                auVar230._4_4_ = fVar217 * auVar254._4_4_ * fVar198;
                auVar230._8_4_ = fVar244 * auVar254._8_4_ * fVar198;
                auVar230._12_4_ = fVar238 * auVar254._12_4_ * fVar198;
                auVar260 = ZEXT1664(auVar157);
                auVar254 = vdpps_avx(auVar97,auVar157,0x7f);
                auVar93 = vmaxss_avx(ZEXT416((uint)fVar153),
                                     ZEXT416((uint)(fVar242 * fVar241 * 1.9073486e-06)));
                auVar96 = vdivss_avx512f(ZEXT416((uint)fVar153),auVar96);
                auVar92 = vdpps_avx(local_8a0._0_16_,auVar230,0x7f);
                auVar95 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar153),auVar93);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),auVar96,auVar95);
                auVar95 = vdpps_avx(local_870,auVar157,0x7f);
                fVar243 = auVar254._0_4_ + auVar92._0_4_;
                auVar254 = vdpps_avx(local_8a0._0_16_,auVar97,0x7f);
                auVar97 = vmulss_avx512f(auVar100,auVar98);
                auVar98 = vmulss_avx512f(auVar98,auVar98);
                auVar92 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar99 = vaddss_avx512f(auVar99,ZEXT416((uint)(auVar97._0_4_ * auVar98._0_4_)));
                auVar98 = vfnmadd231ss_fma(auVar254,auVar267,ZEXT416((uint)fVar243));
                auVar97 = vfnmadd231ss_fma(auVar92,auVar267,auVar95);
                auVar254 = vpermilps_avx(local_700._0_16_,0xff);
                fVar251 = fVar251 - auVar254._0_4_;
                auVar254 = vshufps_avx(auVar6,auVar6,0xff);
                auVar92 = vfmsub213ss_fma(auVar98,auVar99,auVar254);
                fVar252 = auVar97._0_4_ * auVar99._0_4_;
                auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar252));
                fVar244 = auVar98._0_4_;
                fVar217 = fVar250 * (auVar92._0_4_ / fVar244);
                auVar239 = ZEXT464((uint)fVar217);
                fVar253 = fVar253 - (fVar250 * (fVar252 / fVar244) -
                                    fVar251 * (auVar95._0_4_ / fVar244));
                auVar255 = ZEXT464((uint)fVar253);
                fVar242 = fVar242 - (fVar251 * (fVar243 / fVar244) - fVar217);
                auVar248 = ZEXT464((uint)fVar242);
                auVar95 = vandps_avx(auVar267,auVar256);
                if (auVar96._0_4_ <= auVar95._0_4_) {
LAB_01d44070:
                  bVar12 = false;
                }
                else {
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar96._0_4_ + auVar93._0_4_)),local_7b0
                                            ,ZEXT416(0x36000000));
                  auVar95 = vandps_avx(auVar256,ZEXT416((uint)fVar251));
                  if (auVar92._0_4_ <= auVar95._0_4_) goto LAB_01d44070;
                  fVar242 = fVar242 + (float)local_7a0._0_4_;
                  auVar248 = ZEXT464((uint)fVar242);
                  bVar12 = true;
                  if ((((fVar218 <= fVar242) &&
                       (fVar243 = *(float *)(ray + k * 4 + 0x100), fVar242 <= fVar243)) &&
                      (0.0 <= fVar253)) && (fVar253 <= 1.0)) {
                    auVar141._0_16_ = ZEXT816(0) << 0x20;
                    auVar140._4_28_ = auVar141._4_28_;
                    auVar140._0_4_ = local_8c0._0_4_;
                    auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar140._0_16_);
                    fVar250 = auVar95._0_4_;
                    auVar95 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar87].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar250 = fVar250 * 1.5 + auVar95._0_4_ * fVar250 * fVar250 * fVar250;
                      auVar184._0_4_ = local_8a0._0_4_ * fVar250;
                      auVar184._4_4_ = local_8a0._4_4_ * fVar250;
                      auVar184._8_4_ = local_8a0._8_4_ * fVar250;
                      auVar184._12_4_ = local_8a0._12_4_ * fVar250;
                      auVar96 = vfmadd213ps_fma(auVar254,auVar184,auVar6);
                      auVar95 = vshufps_avx(auVar184,auVar184,0xc9);
                      auVar254 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar185._0_4_ = auVar184._0_4_ * auVar254._0_4_;
                      auVar185._4_4_ = auVar184._4_4_ * auVar254._4_4_;
                      auVar185._8_4_ = auVar184._8_4_ * auVar254._8_4_;
                      auVar185._12_4_ = auVar184._12_4_ * auVar254._12_4_;
                      auVar92 = vfmsub231ps_fma(auVar185,auVar6,auVar95);
                      auVar95 = vshufps_avx(auVar92,auVar92,0xc9);
                      auVar254 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                      auVar159._0_4_ = auVar96._0_4_ * auVar92._0_4_;
                      auVar159._4_4_ = auVar96._4_4_ * auVar92._4_4_;
                      auVar159._8_4_ = auVar96._8_4_ * auVar92._8_4_;
                      auVar159._12_4_ = auVar96._12_4_ * auVar92._12_4_;
                      auVar95 = vfmsub231ps_fma(auVar159,auVar95,auVar254);
                      uVar155 = auVar95._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        uVar8 = vextractps_avx(auVar95,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar95,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar155;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar253;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x220) = uVar5;
                        *(uint *)(ray + k * 4 + 0x240) = uVar87;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar210._8_4_ = 1;
                        auVar210._0_8_ = 0x100000001;
                        auVar210._12_4_ = 1;
                        auVar210._16_4_ = 1;
                        auVar210._20_4_ = 1;
                        auVar210._24_4_ = 1;
                        auVar210._28_4_ = 1;
                        auVar106 = vpermps_avx2(auVar210,ZEXT1632(auVar95));
                        auVar226._8_4_ = 2;
                        auVar226._0_8_ = 0x200000002;
                        auVar226._12_4_ = 2;
                        auVar226._16_4_ = 2;
                        auVar226._20_4_ = 2;
                        auVar226._24_4_ = 2;
                        auVar226._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar226,ZEXT1632(auVar95));
                        local_5a0[0] = (RTCHitN)auVar106[0];
                        local_5a0[1] = (RTCHitN)auVar106[1];
                        local_5a0[2] = (RTCHitN)auVar106[2];
                        local_5a0[3] = (RTCHitN)auVar106[3];
                        local_5a0[4] = (RTCHitN)auVar106[4];
                        local_5a0[5] = (RTCHitN)auVar106[5];
                        local_5a0[6] = (RTCHitN)auVar106[6];
                        local_5a0[7] = (RTCHitN)auVar106[7];
                        local_5a0[8] = (RTCHitN)auVar106[8];
                        local_5a0[9] = (RTCHitN)auVar106[9];
                        local_5a0[10] = (RTCHitN)auVar106[10];
                        local_5a0[0xb] = (RTCHitN)auVar106[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar106[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar106[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar106[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar106[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar106[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar106[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar106[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar106[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar106[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar106[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar106[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar106[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar106[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar106[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar106[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar106[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar106[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar106[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar106[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar106[0x1f];
                        local_560 = uVar155;
                        uStack_55c = uVar155;
                        uStack_558 = uVar155;
                        uStack_554 = uVar155;
                        uStack_550 = uVar155;
                        uStack_54c = uVar155;
                        uStack_548 = uVar155;
                        uStack_544 = uVar155;
                        local_540 = fVar253;
                        fStack_53c = fVar253;
                        fStack_538 = fVar253;
                        fStack_534 = fVar253;
                        fStack_530 = fVar253;
                        fStack_52c = fVar253;
                        fStack_528 = fVar253;
                        fStack_524 = fVar253;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_640._0_8_;
                        uStack_4f8 = local_640._8_8_;
                        uStack_4f0 = local_640._16_8_;
                        uStack_4e8 = local_640._24_8_;
                        local_4e0 = local_620;
                        auVar106 = vpcmpeqd_avx2(local_620,local_620);
                        local_930[1] = auVar106;
                        *local_930 = auVar106;
                        local_4c0 = pRVar10->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar10->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        local_7e0 = local_660._0_8_;
                        uStack_7d8 = local_660._8_8_;
                        uStack_7d0 = local_660._16_8_;
                        uStack_7c8 = local_660._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar9->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_5a0;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar239 = ZEXT464((uint)fVar217);
                          auVar249 = ZEXT1664(local_8a0._0_16_);
                          auVar260 = ZEXT1664(auVar157);
                          auVar265 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_990);
                          auVar248 = ZEXT1664(ZEXT416((uint)fVar242));
                          auVar255 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar268 = ZEXT3264(local_900);
                          auVar269 = ZEXT3264(local_8e0);
                          auVar256._8_4_ = 0x7fffffff;
                          auVar256._0_8_ = 0x7fffffff7fffffff;
                          auVar256._12_4_ = 0x7fffffff;
                        }
                        auVar65._8_8_ = uStack_7d8;
                        auVar65._0_8_ = local_7e0;
                        auVar65._16_8_ = uStack_7d0;
                        auVar65._24_8_ = uStack_7c8;
                        if (auVar65 != (undefined1  [32])0x0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar239 = ZEXT1664(auVar239._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar265 = ZEXT1664(auVar265._0_16_);
                            (*p_Var11)(&local_990);
                            auVar248 = ZEXT1664(ZEXT416((uint)fVar242));
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar268 = ZEXT3264(local_900);
                            auVar269 = ZEXT3264(local_8e0);
                            auVar256._8_4_ = 0x7fffffff;
                            auVar256._0_8_ = 0x7fffffff7fffffff;
                            auVar256._12_4_ = 0x7fffffff;
                          }
                          auVar66._8_8_ = uStack_7d8;
                          auVar66._0_8_ = local_7e0;
                          auVar66._16_8_ = uStack_7d0;
                          auVar66._24_8_ = uStack_7c8;
                          if (auVar66 != (undefined1  [32])0x0) {
                            uVar90 = vptestmd_avx512vl(auVar66,auVar66);
                            iVar3 = *(int *)(local_990.hit + 4);
                            iVar4 = *(int *)(local_990.hit + 8);
                            iVar1 = *(int *)(local_990.hit + 0xc);
                            iVar61 = *(int *)(local_990.hit + 0x10);
                            iVar62 = *(int *)(local_990.hit + 0x14);
                            iVar63 = *(int *)(local_990.hit + 0x18);
                            iVar64 = *(int *)(local_990.hit + 0x1c);
                            bVar80 = (byte)uVar90;
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar80 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x19c);
                            iVar3 = *(int *)(local_990.hit + 0x24);
                            iVar4 = *(int *)(local_990.hit + 0x28);
                            iVar1 = *(int *)(local_990.hit + 0x2c);
                            iVar61 = *(int *)(local_990.hit + 0x30);
                            iVar62 = *(int *)(local_990.hit + 0x34);
                            iVar63 = *(int *)(local_990.hit + 0x38);
                            iVar64 = *(int *)(local_990.hit + 0x3c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1bc);
                            iVar3 = *(int *)(local_990.hit + 0x44);
                            iVar4 = *(int *)(local_990.hit + 0x48);
                            iVar1 = *(int *)(local_990.hit + 0x4c);
                            iVar61 = *(int *)(local_990.hit + 0x50);
                            iVar62 = *(int *)(local_990.hit + 0x54);
                            iVar63 = *(int *)(local_990.hit + 0x58);
                            iVar64 = *(int *)(local_990.hit + 0x5c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1dc);
                            iVar3 = *(int *)(local_990.hit + 100);
                            iVar4 = *(int *)(local_990.hit + 0x68);
                            iVar1 = *(int *)(local_990.hit + 0x6c);
                            iVar61 = *(int *)(local_990.hit + 0x70);
                            iVar62 = *(int *)(local_990.hit + 0x74);
                            iVar63 = *(int *)(local_990.hit + 0x78);
                            iVar64 = *(int *)(local_990.hit + 0x7c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1fc);
                            iVar3 = *(int *)(local_990.hit + 0x84);
                            iVar4 = *(int *)(local_990.hit + 0x88);
                            iVar1 = *(int *)(local_990.hit + 0x8c);
                            iVar61 = *(int *)(local_990.hit + 0x90);
                            iVar62 = *(int *)(local_990.hit + 0x94);
                            iVar63 = *(int *)(local_990.hit + 0x98);
                            iVar64 = *(int *)(local_990.hit + 0x9c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x21c);
                            auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar106;
                            auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar106;
                            auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar106;
                            auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar106;
                            goto LAB_01d44073;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar243;
                      }
                    }
                  }
                }
LAB_01d44073:
                bVar89 = lVar88 != 0;
                lVar88 = lVar88 + -1;
              } while ((!bVar12) && (bVar89));
              auVar71._4_4_ = fStack_6bc;
              auVar71._0_4_ = local_6c0;
              auVar71._8_4_ = fStack_6b8;
              auVar71._12_4_ = fStack_6b4;
              auVar71._16_4_ = fStack_6b0;
              auVar71._20_4_ = fStack_6ac;
              auVar71._24_4_ = fStack_6a8;
              auVar71._28_4_ = fStack_6a4;
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar32._4_4_ = uVar155;
              auVar32._0_4_ = uVar155;
              auVar32._8_4_ = uVar155;
              auVar32._12_4_ = uVar155;
              auVar32._16_4_ = uVar155;
              auVar32._20_4_ = uVar155;
              auVar32._24_4_ = uVar155;
              auVar32._28_4_ = uVar155;
              uVar22 = vcmpps_avx512vl(auVar71,auVar32,2);
              bVar84 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar84 & (byte)uVar22;
            } while (bVar84 != 0);
          }
          auVar169._0_4_ = (float)local_6e0._0_4_ + (float)local_720._0_4_;
          auVar169._4_4_ = (float)local_6e0._4_4_ + (float)local_720._4_4_;
          auVar169._8_4_ = fStack_6d8 + fStack_718;
          auVar169._12_4_ = fStack_6d4 + fStack_714;
          auVar169._16_4_ = fStack_6d0 + fStack_710;
          auVar169._20_4_ = fStack_6cc + fStack_70c;
          auVar169._24_4_ = fStack_6c8 + fStack_708;
          auVar169._28_4_ = fStack_6c4 + fStack_704;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar33._4_4_ = uVar155;
          auVar33._0_4_ = uVar155;
          auVar33._8_4_ = uVar155;
          auVar33._12_4_ = uVar155;
          auVar33._16_4_ = uVar155;
          auVar33._20_4_ = uVar155;
          auVar33._24_4_ = uVar155;
          auVar33._28_4_ = uVar155;
          uVar22 = vcmpps_avx512vl(auVar169,auVar33,2);
          bVar85 = (byte)uVar20 | ~bVar85;
          bVar78 = (byte)uVar21 & bVar78 & (byte)uVar22;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar106 = vpblendmd_avx512vl(auVar170,auVar34);
          local_6e0._0_4_ = (uint)(bVar85 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar85 & 1) * 2;
          bVar12 = (bool)(bVar85 >> 1 & 1);
          local_6e0._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar85 >> 2 & 1);
          fStack_6d8 = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar85 >> 3 & 1);
          fStack_6d4 = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar85 >> 4 & 1);
          fStack_6d0 = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar85 >> 5 & 1);
          fStack_6cc = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar85 >> 6 & 1);
          fStack_6c8 = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * 2);
          fStack_6c4 = (float)((uint)(bVar85 >> 7) * auVar106._28_4_ |
                              (uint)!(bool)(bVar85 >> 7) * 2);
          uVar20 = vpcmpd_avx512vl(_local_6e0,local_600,2);
          bVar85 = (byte)uVar20 & bVar78;
          if (bVar85 != 0) {
            auVar254 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar95 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar92 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar6 = vminps_avx(auVar254,auVar92);
            auVar254 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar92 = vmaxps_avx(auVar95,auVar254);
            auVar95 = vandps_avx(auVar256,auVar6);
            auVar254 = vandps_avx(auVar256,auVar92);
            auVar95 = vmaxps_avx(auVar95,auVar254);
            auVar254 = vmovshdup_avx(auVar95);
            auVar254 = vmaxss_avx(auVar254,auVar95);
            auVar95 = vshufpd_avx(auVar95,auVar95,1);
            auVar95 = vmaxss_avx(auVar95,auVar254);
            fVar153 = auVar95._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar92,auVar92,0xff);
            _local_740 = _local_480;
            local_6c0 = (float)local_480._0_4_ + (float)local_720._0_4_;
            fStack_6bc = (float)local_480._4_4_ + (float)local_720._4_4_;
            fStack_6b8 = fStack_478 + fStack_718;
            fStack_6b4 = fStack_474 + fStack_714;
            fStack_6b0 = fStack_470 + fStack_710;
            fStack_6ac = fStack_46c + fStack_70c;
            fStack_6a8 = fStack_468 + fStack_708;
            fStack_6a4 = fStack_464 + fStack_704;
            do {
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar106 = vblendmps_avx512vl(auVar171,_local_740);
              auVar142._0_4_ =
                   (uint)(bVar85 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar85 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 1 & 1);
              auVar142._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 2 & 1);
              auVar142._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 3 & 1);
              auVar142._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 4 & 1);
              auVar142._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 5 & 1);
              auVar142._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar142._24_4_ =
                   (uint)(bVar85 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar85 >> 6) * 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar106 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar106 = vminps_avx(auVar142,auVar106);
              auVar104 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar104);
              auVar104 = vpermpd_avx2(auVar106,0x4e);
              auVar106 = vminps_avx(auVar106,auVar104);
              uVar20 = vcmpps_avx512vl(auVar142,auVar106,0);
              bVar80 = (byte)uVar20 & bVar85;
              bVar84 = bVar85;
              if (bVar80 != 0) {
                bVar84 = bVar80;
              }
              iVar2 = 0;
              for (uVar91 = (uint)bVar84; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar91 = *(uint *)(local_6a0 + (uint)(iVar2 << 2));
              uVar146 = *(uint *)(local_460 + (uint)(iVar2 << 2));
              fVar241 = auVar94._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_880._0_4_);
              }
              auVar255 = ZEXT464(uVar91);
              auVar249 = ZEXT464(uVar146);
              lVar88 = 4;
              do {
                fVar242 = auVar249._0_4_;
                auVar160._4_4_ = fVar242;
                auVar160._0_4_ = fVar242;
                auVar160._8_4_ = fVar242;
                auVar160._12_4_ = fVar242;
                auVar95 = vfmadd132ps_fma(auVar160,ZEXT816(0) << 0x40,local_870);
                fVar253 = auVar255._0_4_;
                fVar238 = 1.0 - fVar253;
                fVar251 = fVar238 * fVar238 * fVar238;
                fVar243 = fVar253 * fVar253;
                fVar244 = fVar253 * fVar243;
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                           ZEXT416((uint)fVar244));
                fVar250 = fVar253 * fVar238;
                auVar93 = ZEXT416((uint)fVar238);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar250 * 6.0)),
                                         ZEXT416((uint)(fVar250 * fVar238)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                          ZEXT416((uint)fVar251));
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar238 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar253 * fVar250)));
                fVar251 = fVar251 * 0.16666667;
                fVar252 = (auVar254._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar217 = (auVar92._0_4_ + auVar96._0_4_) * 0.16666667;
                fVar244 = fVar244 * 0.16666667;
                auVar204._0_4_ = fVar244 * (float)local_860._0_4_;
                auVar204._4_4_ = fVar244 * (float)local_860._4_4_;
                auVar204._8_4_ = fVar244 * fStack_858;
                auVar204._12_4_ = fVar244 * fStack_854;
                auVar231._4_4_ = fVar217;
                auVar231._0_4_ = fVar217;
                auVar231._8_4_ = fVar217;
                auVar231._12_4_ = fVar217;
                auVar254 = vfmadd132ps_fma(auVar231,auVar204,local_820._0_16_);
                auVar205._4_4_ = fVar252;
                auVar205._0_4_ = fVar252;
                auVar205._8_4_ = fVar252;
                auVar205._12_4_ = fVar252;
                auVar254 = vfmadd132ps_fma(auVar205,auVar254,local_840._0_16_);
                auVar186._4_4_ = fVar251;
                auVar186._0_4_ = fVar251;
                auVar186._8_4_ = fVar251;
                auVar186._12_4_ = fVar251;
                auVar254 = vfmadd132ps_fma(auVar186,auVar254,local_800._0_16_);
                local_700._0_16_ = auVar254;
                auVar95 = vsubps_avx(auVar95,auVar254);
                local_8a0._0_16_ = auVar95;
                auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
                auVar254 = auVar255._0_16_;
                local_8c0._0_16_ = auVar95;
                if (auVar95._0_4_ < 0.0) {
                  local_960._0_4_ = fVar243;
                  auVar239._0_4_ = sqrtf(auVar95._0_4_);
                  auVar239._4_60_ = extraout_var_01;
                  auVar95 = auVar239._0_16_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  local_960._0_4_ = fVar243;
                }
                auVar6 = vfnmsub213ss_fma(auVar254,auVar254,ZEXT416((uint)(fVar250 * 4.0)));
                auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),auVar93,auVar93);
                fVar243 = fVar238 * -fVar238 * 0.5;
                fVar250 = auVar6._0_4_ * 0.5;
                fVar251 = auVar92._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar221._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar221._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar221._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar221._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar187._4_4_ = fVar251;
                auVar187._0_4_ = fVar251;
                auVar187._8_4_ = fVar251;
                auVar187._12_4_ = fVar251;
                auVar92 = vfmadd132ps_fma(auVar187,auVar221,local_820._0_16_);
                auVar206._4_4_ = fVar250;
                auVar206._0_4_ = fVar250;
                auVar206._8_4_ = fVar250;
                auVar206._12_4_ = fVar250;
                auVar92 = vfmadd132ps_fma(auVar206,auVar92,local_840._0_16_);
                auVar262._4_4_ = fVar243;
                auVar262._0_4_ = fVar243;
                auVar262._8_4_ = fVar243;
                auVar262._12_4_ = fVar243;
                local_960._0_16_ = vfmadd132ps_fma(auVar262,auVar92,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar243 = local_760._0_4_;
                auVar92 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar243));
                fVar250 = auVar92._0_4_;
                local_770 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar243));
                auVar92 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar91 = auVar95._0_4_;
                local_750 = fVar238;
                fStack_74c = fVar238;
                fStack_748 = fVar238;
                fStack_744 = fVar238;
                if (fVar243 < -fVar243) {
                  auVar248._0_4_ = sqrtf(fVar243);
                  auVar248._4_60_ = extraout_var_02;
                  auVar95 = ZEXT416(uVar91);
                  auVar96 = auVar248._0_16_;
                  auVar6 = local_960._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx512f(local_760,local_760);
                  auVar6 = local_960._0_16_;
                }
                fVar243 = fVar250 * 1.5 + fVar243 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar161._0_4_ = auVar6._0_4_ * fVar243;
                auVar161._4_4_ = auVar6._4_4_ * fVar243;
                auVar161._8_4_ = auVar6._8_4_ * fVar243;
                auVar161._12_4_ = auVar6._12_4_ * fVar243;
                auVar267 = vdpps_avx(local_8a0._0_16_,auVar161,0x7f);
                fVar252 = auVar95._0_4_;
                fVar250 = auVar267._0_4_;
                auVar162._0_4_ = fVar250 * fVar250;
                auVar162._4_4_ = auVar267._4_4_ * auVar267._4_4_;
                auVar162._8_4_ = auVar267._8_4_ * auVar267._8_4_;
                auVar162._12_4_ = auVar267._12_4_ * auVar267._12_4_;
                auVar97 = vsubps_avx512vl(local_8c0._0_16_,auVar162);
                fVar251 = auVar97._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar251;
                auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar99 = vmulss_avx512f(auVar98,ZEXT416(0x3fc00000));
                auVar100 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                if (fVar251 < 0.0) {
                  local_790 = fVar243;
                  fStack_78c = fVar243;
                  fStack_788 = fVar243;
                  fStack_784 = fVar243;
                  local_780 = auVar98;
                  fVar251 = sqrtf(fVar251);
                  auVar100 = ZEXT416(auVar100._0_4_);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar95 = ZEXT416(uVar91);
                  auVar6 = local_960._0_16_;
                  auVar98 = local_780;
                  fVar243 = local_790;
                  fVar217 = fStack_78c;
                  fVar244 = fStack_788;
                  fVar238 = fStack_784;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar251 = auVar97._0_4_;
                  fVar217 = fVar243;
                  fVar244 = fVar243;
                  fVar238 = fVar243;
                }
                auVar265 = ZEXT1664(auVar6);
                auVar247._8_4_ = 0x7fffffff;
                auVar247._0_8_ = 0x7fffffff7fffffff;
                auVar247._12_4_ = 0x7fffffff;
                auVar248 = ZEXT1664(auVar247);
                auVar269 = ZEXT3264(local_8e0);
                auVar268 = ZEXT3264(local_900);
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar93,auVar254);
                auVar254 = vfmadd231ss_fma(auVar93,auVar254,SUB6416(ZEXT464(0xc0000000),0));
                auVar207._0_4_ = fVar253 * (float)local_860._0_4_;
                auVar207._4_4_ = fVar253 * (float)local_860._4_4_;
                auVar207._8_4_ = fVar253 * fStack_858;
                auVar207._12_4_ = fVar253 * fStack_854;
                auVar222._0_4_ = auVar254._0_4_;
                auVar222._4_4_ = auVar222._0_4_;
                auVar222._8_4_ = auVar222._0_4_;
                auVar222._12_4_ = auVar222._0_4_;
                auVar254 = vfmadd132ps_fma(auVar222,auVar207,local_820._0_16_);
                auVar189._0_4_ = auVar97._0_4_;
                auVar189._4_4_ = auVar189._0_4_;
                auVar189._8_4_ = auVar189._0_4_;
                auVar189._12_4_ = auVar189._0_4_;
                auVar254 = vfmadd132ps_fma(auVar189,auVar254,local_840._0_16_);
                auVar70._4_4_ = fStack_74c;
                auVar70._0_4_ = local_750;
                auVar70._8_4_ = fStack_748;
                auVar70._12_4_ = fStack_744;
                auVar254 = vfmadd132ps_fma(auVar70,auVar254,local_800._0_16_);
                auVar190._0_4_ = auVar254._0_4_ * (float)local_760._0_4_;
                auVar190._4_4_ = auVar254._4_4_ * (float)local_760._0_4_;
                auVar190._8_4_ = auVar254._8_4_ * (float)local_760._0_4_;
                auVar190._12_4_ = auVar254._12_4_ * (float)local_760._0_4_;
                auVar254 = vdpps_avx(auVar6,auVar254,0x7f);
                fVar198 = auVar254._0_4_;
                auVar208._0_4_ = auVar6._0_4_ * fVar198;
                auVar208._4_4_ = auVar6._4_4_ * fVar198;
                auVar208._8_4_ = auVar6._8_4_ * fVar198;
                auVar208._12_4_ = auVar6._12_4_ * fVar198;
                auVar254 = vsubps_avx(auVar190,auVar208);
                fVar198 = auVar92._0_4_ * (float)local_770._0_4_;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar144._16_16_ = local_900._16_16_;
                auVar97 = vxorps_avx512vl(auVar6,auVar24);
                auVar232._0_4_ = fVar243 * auVar254._0_4_ * fVar198;
                auVar232._4_4_ = fVar217 * auVar254._4_4_ * fVar198;
                auVar232._8_4_ = fVar244 * auVar254._8_4_ * fVar198;
                auVar232._12_4_ = fVar238 * auVar254._12_4_ * fVar198;
                auVar260 = ZEXT1664(auVar161);
                auVar254 = vdpps_avx(auVar97,auVar161,0x7f);
                auVar93 = vmaxss_avx(ZEXT416((uint)fVar153),
                                     ZEXT416((uint)(fVar242 * fVar241 * 1.9073486e-06)));
                auVar96 = vdivss_avx512f(ZEXT416((uint)fVar153),auVar96);
                auVar92 = vdpps_avx(local_8a0._0_16_,auVar232,0x7f);
                auVar95 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar153),auVar93);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),auVar96,auVar95);
                auVar95 = vdpps_avx(local_870,auVar161,0x7f);
                fVar243 = auVar254._0_4_ + auVar92._0_4_;
                auVar254 = vdpps_avx(local_8a0._0_16_,auVar97,0x7f);
                auVar97 = vmulss_avx512f(auVar100,auVar98);
                auVar98 = vmulss_avx512f(auVar98,auVar98);
                auVar92 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar99 = vaddss_avx512f(auVar99,ZEXT416((uint)(auVar97._0_4_ * auVar98._0_4_)));
                auVar98 = vfnmadd231ss_fma(auVar254,auVar267,ZEXT416((uint)fVar243));
                auVar97 = vfnmadd231ss_fma(auVar92,auVar267,auVar95);
                auVar254 = vpermilps_avx(local_700._0_16_,0xff);
                fVar251 = fVar251 - auVar254._0_4_;
                auVar254 = vshufps_avx(auVar6,auVar6,0xff);
                auVar92 = vfmsub213ss_fma(auVar98,auVar99,auVar254);
                fVar252 = auVar97._0_4_ * auVar99._0_4_;
                auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar252));
                fVar244 = auVar98._0_4_;
                fVar217 = fVar250 * (auVar92._0_4_ / fVar244);
                auVar239 = ZEXT464((uint)fVar217);
                fVar253 = fVar253 - (fVar250 * (fVar252 / fVar244) -
                                    fVar251 * (auVar95._0_4_ / fVar244));
                auVar255 = ZEXT464((uint)fVar253);
                fVar242 = fVar242 - (fVar251 * (fVar243 / fVar244) - fVar217);
                auVar249 = ZEXT464((uint)fVar242);
                auVar95 = vandps_avx(auVar267,auVar247);
                if (auVar96._0_4_ <= auVar95._0_4_) {
LAB_01d44c4c:
                  bVar12 = false;
                }
                else {
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar96._0_4_ + auVar93._0_4_)),local_7b0
                                            ,ZEXT416(0x36000000));
                  auVar95 = vandps_avx(auVar247,ZEXT416((uint)fVar251));
                  if (auVar92._0_4_ <= auVar95._0_4_) goto LAB_01d44c4c;
                  fVar242 = fVar242 + (float)local_7a0._0_4_;
                  auVar249 = ZEXT464((uint)fVar242);
                  bVar12 = true;
                  if ((((fVar218 <= fVar242) &&
                       (fVar243 = *(float *)(ray + k * 4 + 0x100), fVar242 <= fVar243)) &&
                      (0.0 <= fVar253)) && (fVar253 <= 1.0)) {
                    auVar144._0_16_ = ZEXT816(0) << 0x20;
                    auVar143._4_28_ = auVar144._4_28_;
                    auVar143._0_4_ = local_8c0._0_4_;
                    auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar143._0_16_);
                    fVar250 = auVar95._0_4_;
                    auVar95 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar87].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar250 = fVar250 * 1.5 + auVar95._0_4_ * fVar250 * fVar250 * fVar250;
                      auVar191._0_4_ = local_8a0._0_4_ * fVar250;
                      auVar191._4_4_ = local_8a0._4_4_ * fVar250;
                      auVar191._8_4_ = local_8a0._8_4_ * fVar250;
                      auVar191._12_4_ = local_8a0._12_4_ * fVar250;
                      auVar96 = vfmadd213ps_fma(auVar254,auVar191,auVar6);
                      auVar95 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar254 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar192._0_4_ = auVar191._0_4_ * auVar254._0_4_;
                      auVar192._4_4_ = auVar191._4_4_ * auVar254._4_4_;
                      auVar192._8_4_ = auVar191._8_4_ * auVar254._8_4_;
                      auVar192._12_4_ = auVar191._12_4_ * auVar254._12_4_;
                      auVar92 = vfmsub231ps_fma(auVar192,auVar6,auVar95);
                      auVar95 = vshufps_avx(auVar92,auVar92,0xc9);
                      auVar254 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar92 = vshufps_avx(auVar92,auVar92,0xd2);
                      auVar163._0_4_ = auVar96._0_4_ * auVar92._0_4_;
                      auVar163._4_4_ = auVar96._4_4_ * auVar92._4_4_;
                      auVar163._8_4_ = auVar96._8_4_ * auVar92._8_4_;
                      auVar163._12_4_ = auVar96._12_4_ * auVar92._12_4_;
                      auVar95 = vfmsub231ps_fma(auVar163,auVar95,auVar254);
                      uVar155 = auVar95._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        uVar8 = vextractps_avx(auVar95,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar95,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar155;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar253;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x220) = uVar5;
                        *(uint *)(ray + k * 4 + 0x240) = uVar87;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar211._8_4_ = 1;
                        auVar211._0_8_ = 0x100000001;
                        auVar211._12_4_ = 1;
                        auVar211._16_4_ = 1;
                        auVar211._20_4_ = 1;
                        auVar211._24_4_ = 1;
                        auVar211._28_4_ = 1;
                        auVar106 = vpermps_avx2(auVar211,ZEXT1632(auVar95));
                        auVar227._8_4_ = 2;
                        auVar227._0_8_ = 0x200000002;
                        auVar227._12_4_ = 2;
                        auVar227._16_4_ = 2;
                        auVar227._20_4_ = 2;
                        auVar227._24_4_ = 2;
                        auVar227._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar227,ZEXT1632(auVar95));
                        local_5a0[0] = (RTCHitN)auVar106[0];
                        local_5a0[1] = (RTCHitN)auVar106[1];
                        local_5a0[2] = (RTCHitN)auVar106[2];
                        local_5a0[3] = (RTCHitN)auVar106[3];
                        local_5a0[4] = (RTCHitN)auVar106[4];
                        local_5a0[5] = (RTCHitN)auVar106[5];
                        local_5a0[6] = (RTCHitN)auVar106[6];
                        local_5a0[7] = (RTCHitN)auVar106[7];
                        local_5a0[8] = (RTCHitN)auVar106[8];
                        local_5a0[9] = (RTCHitN)auVar106[9];
                        local_5a0[10] = (RTCHitN)auVar106[10];
                        local_5a0[0xb] = (RTCHitN)auVar106[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar106[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar106[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar106[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar106[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar106[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar106[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar106[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar106[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar106[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar106[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar106[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar106[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar106[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar106[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar106[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar106[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar106[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar106[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar106[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar106[0x1f];
                        local_560 = uVar155;
                        uStack_55c = uVar155;
                        uStack_558 = uVar155;
                        uStack_554 = uVar155;
                        uStack_550 = uVar155;
                        uStack_54c = uVar155;
                        uStack_548 = uVar155;
                        uStack_544 = uVar155;
                        local_540 = fVar253;
                        fStack_53c = fVar253;
                        fStack_538 = fVar253;
                        fStack_534 = fVar253;
                        fStack_530 = fVar253;
                        fStack_52c = fVar253;
                        fStack_528 = fVar253;
                        fStack_524 = fVar253;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_640._0_8_;
                        uStack_4f8 = local_640._8_8_;
                        uStack_4f0 = local_640._16_8_;
                        uStack_4e8 = local_640._24_8_;
                        local_4e0 = local_620;
                        auVar106 = vpcmpeqd_avx2(local_620,local_620);
                        local_930[1] = auVar106;
                        *local_930 = auVar106;
                        local_4c0 = pRVar10->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar10->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        local_7e0 = local_660._0_8_;
                        uStack_7d8 = local_660._8_8_;
                        uStack_7d0 = local_660._16_8_;
                        uStack_7c8 = local_660._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar9->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_5a0;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar239 = ZEXT464((uint)fVar217);
                          auVar248 = ZEXT1664(auVar247);
                          auVar260 = ZEXT1664(auVar161);
                          auVar265 = ZEXT1664(auVar6);
                          (*pGVar9->intersectionFilterN)(&local_990);
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar242));
                          auVar255 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar268 = ZEXT3264(local_900);
                          auVar269 = ZEXT3264(local_8e0);
                        }
                        auVar67._8_8_ = uStack_7d8;
                        auVar67._0_8_ = local_7e0;
                        auVar67._16_8_ = uStack_7d0;
                        auVar67._24_8_ = uStack_7c8;
                        if (auVar67 != (undefined1  [32])0x0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar239 = ZEXT1664(auVar239._0_16_);
                            auVar248 = ZEXT1664(auVar248._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar265 = ZEXT1664(auVar265._0_16_);
                            (*p_Var11)(&local_990);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar242));
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar268 = ZEXT3264(local_900);
                            auVar269 = ZEXT3264(local_8e0);
                          }
                          auVar68._8_8_ = uStack_7d8;
                          auVar68._0_8_ = local_7e0;
                          auVar68._16_8_ = uStack_7d0;
                          auVar68._24_8_ = uStack_7c8;
                          if (auVar68 != (undefined1  [32])0x0) {
                            uVar90 = vptestmd_avx512vl(auVar68,auVar68);
                            iVar3 = *(int *)(local_990.hit + 4);
                            iVar4 = *(int *)(local_990.hit + 8);
                            iVar1 = *(int *)(local_990.hit + 0xc);
                            iVar61 = *(int *)(local_990.hit + 0x10);
                            iVar62 = *(int *)(local_990.hit + 0x14);
                            iVar63 = *(int *)(local_990.hit + 0x18);
                            iVar64 = *(int *)(local_990.hit + 0x1c);
                            bVar84 = (byte)uVar90;
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar84 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar84 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x19c);
                            iVar3 = *(int *)(local_990.hit + 0x24);
                            iVar4 = *(int *)(local_990.hit + 0x28);
                            iVar1 = *(int *)(local_990.hit + 0x2c);
                            iVar61 = *(int *)(local_990.hit + 0x30);
                            iVar62 = *(int *)(local_990.hit + 0x34);
                            iVar63 = *(int *)(local_990.hit + 0x38);
                            iVar64 = *(int *)(local_990.hit + 0x3c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar84 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar84 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1bc);
                            iVar3 = *(int *)(local_990.hit + 0x44);
                            iVar4 = *(int *)(local_990.hit + 0x48);
                            iVar1 = *(int *)(local_990.hit + 0x4c);
                            iVar61 = *(int *)(local_990.hit + 0x50);
                            iVar62 = *(int *)(local_990.hit + 0x54);
                            iVar63 = *(int *)(local_990.hit + 0x58);
                            iVar64 = *(int *)(local_990.hit + 0x5c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar84 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar84 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1dc);
                            iVar3 = *(int *)(local_990.hit + 100);
                            iVar4 = *(int *)(local_990.hit + 0x68);
                            iVar1 = *(int *)(local_990.hit + 0x6c);
                            iVar61 = *(int *)(local_990.hit + 0x70);
                            iVar62 = *(int *)(local_990.hit + 0x74);
                            iVar63 = *(int *)(local_990.hit + 0x78);
                            iVar64 = *(int *)(local_990.hit + 0x7c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar84 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar84 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1fc);
                            iVar3 = *(int *)(local_990.hit + 0x84);
                            iVar4 = *(int *)(local_990.hit + 0x88);
                            iVar1 = *(int *)(local_990.hit + 0x8c);
                            iVar61 = *(int *)(local_990.hit + 0x90);
                            iVar62 = *(int *)(local_990.hit + 0x94);
                            iVar63 = *(int *)(local_990.hit + 0x98);
                            iVar64 = *(int *)(local_990.hit + 0x9c);
                            bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                            bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
                            bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
                            bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
                            bVar18 = SUB81(uVar90 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar84 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar84 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar89 * iVar3 |
                                 (uint)!bVar89 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar18 * iVar64 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x21c);
                            auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar106;
                            auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar106;
                            auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar106;
                            auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar106;
                            goto LAB_01d44c4f;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar243;
                      }
                    }
                  }
                }
LAB_01d44c4f:
                bVar89 = lVar88 != 0;
                lVar88 = lVar88 + -1;
              } while ((!bVar12) && (bVar89));
              auVar72._4_4_ = fStack_6bc;
              auVar72._0_4_ = local_6c0;
              auVar72._8_4_ = fStack_6b8;
              auVar72._12_4_ = fStack_6b4;
              auVar72._16_4_ = fStack_6b0;
              auVar72._20_4_ = fStack_6ac;
              auVar72._24_4_ = fStack_6a8;
              auVar72._28_4_ = fStack_6a4;
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar35._4_4_ = uVar155;
              auVar35._0_4_ = uVar155;
              auVar35._8_4_ = uVar155;
              auVar35._12_4_ = uVar155;
              auVar35._16_4_ = uVar155;
              auVar35._20_4_ = uVar155;
              auVar35._24_4_ = uVar155;
              auVar35._28_4_ = uVar155;
              uVar20 = vcmpps_avx512vl(auVar72,auVar35,2);
              bVar85 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar85 & (byte)uVar20;
            } while (bVar85 != 0);
          }
          uVar22 = vpcmpd_avx512vl(local_600,_local_6e0,1);
          uVar21 = vpcmpd_avx512vl(local_600,local_440,1);
          auVar193._0_4_ = (float)local_720._0_4_ + (float)local_1c0._0_4_;
          auVar193._4_4_ = (float)local_720._4_4_ + (float)local_1c0._4_4_;
          auVar193._8_4_ = fStack_718 + fStack_1b8;
          auVar193._12_4_ = fStack_714 + fStack_1b4;
          auVar193._16_4_ = fStack_710 + fStack_1b0;
          auVar193._20_4_ = fStack_70c + fStack_1ac;
          auVar193._24_4_ = fStack_708 + fStack_1a8;
          auVar193._28_4_ = fStack_704 + fStack_1a4;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar212._4_4_ = uVar155;
          auVar212._0_4_ = uVar155;
          auVar212._8_4_ = uVar155;
          auVar212._12_4_ = uVar155;
          auVar212._16_4_ = uVar155;
          auVar212._20_4_ = uVar155;
          auVar212._24_4_ = uVar155;
          auVar212._28_4_ = uVar155;
          uVar20 = vcmpps_avx512vl(auVar193,auVar212,2);
          bVar81 = bVar81 & (byte)uVar21 & (byte)uVar20;
          auVar228._0_4_ = (float)local_720._0_4_ + (float)local_480._0_4_;
          auVar228._4_4_ = (float)local_720._4_4_ + (float)local_480._4_4_;
          auVar228._8_4_ = fStack_718 + fStack_478;
          auVar228._12_4_ = fStack_714 + fStack_474;
          auVar228._16_4_ = fStack_710 + fStack_470;
          auVar228._20_4_ = fStack_70c + fStack_46c;
          auVar228._24_4_ = fStack_708 + fStack_468;
          auVar228._28_4_ = fStack_704 + fStack_464;
          uVar20 = vcmpps_avx512vl(auVar228,auVar212,2);
          bVar78 = bVar78 & (byte)uVar22 & (byte)uVar20 | bVar81;
          prim = local_920;
          pPVar86 = local_928;
          if (bVar78 == 0) {
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar266 = ZEXT3264(auVar106);
          }
          else {
            uVar90 = local_910 & 0xffffffff;
            abStack_180[uVar90 * 0x60] = bVar78;
            bVar12 = (bool)(bVar81 >> 1 & 1);
            bVar89 = (bool)(bVar81 >> 2 & 1);
            bVar13 = (bool)(bVar81 >> 3 & 1);
            bVar14 = (bool)(bVar81 >> 4 & 1);
            bVar15 = (bool)(bVar81 >> 5 & 1);
            auStack_160[uVar90 * 0x18] =
                 (uint)(bVar81 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar81 & 1) * local_480._0_4_;
            auStack_160[uVar90 * 0x18 + 1] =
                 (uint)bVar12 * local_1c0._4_4_ | (uint)!bVar12 * local_480._4_4_;
            auStack_160[uVar90 * 0x18 + 2] =
                 (uint)bVar89 * (int)fStack_1b8 | (uint)!bVar89 * (int)fStack_478;
            auStack_160[uVar90 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_1b4 | (uint)!bVar13 * (int)fStack_474;
            auStack_160[uVar90 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_1b0 | (uint)!bVar14 * (int)fStack_470;
            auStack_160[uVar90 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_1ac | (uint)!bVar15 * (int)fStack_46c;
            auStack_160[uVar90 * 0x18 + 6] =
                 (uint)(bVar81 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar81 >> 6) * (int)fStack_468;
            (&fStack_144)[uVar90 * 0x18] = fStack_464;
            uVar20 = vmovlps_avx(local_940);
            (&uStack_140)[uVar90 * 0xc] = uVar20;
            afStack_138[uVar90 * 0x18] = (float)((int)local_918 + 1);
            local_910 = (ulong)((int)local_910 + 1);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar266 = ZEXT3264(auVar106);
          }
        }
      }
    }
    auVar213 = ZEXT1664(local_940);
    local_910 = local_910 & 0xffffffff;
    do {
      if ((int)local_910 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar37._4_4_ = uVar5;
        auVar37._0_4_ = uVar5;
        auVar37._8_4_ = uVar5;
        auVar37._12_4_ = uVar5;
        auVar37._16_4_ = uVar5;
        auVar37._20_4_ = uVar5;
        auVar37._24_4_ = uVar5;
        auVar37._28_4_ = uVar5;
        uVar20 = vcmpps_avx512vl(local_420,auVar37,2);
        uVar87 = (uint)local_908 & (uint)uVar20;
        local_908 = (ulong)uVar87;
        if (uVar87 == 0) {
          return;
        }
        goto LAB_01d4296d;
      }
      uVar90 = (ulong)((int)local_910 - 1);
      auVar106 = *(undefined1 (*) [32])(auStack_160 + uVar90 * 0x18);
      auVar194._0_4_ = auVar106._0_4_ + (float)local_720._0_4_;
      auVar194._4_4_ = auVar106._4_4_ + (float)local_720._4_4_;
      auVar194._8_4_ = auVar106._8_4_ + fStack_718;
      auVar194._12_4_ = auVar106._12_4_ + fStack_714;
      auVar194._16_4_ = auVar106._16_4_ + fStack_710;
      auVar194._20_4_ = auVar106._20_4_ + fStack_70c;
      auVar194._24_4_ = auVar106._24_4_ + fStack_708;
      auVar194._28_4_ = auVar106._28_4_ + fStack_704;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar155;
      auVar36._0_4_ = uVar155;
      auVar36._8_4_ = uVar155;
      auVar36._12_4_ = uVar155;
      auVar36._16_4_ = uVar155;
      auVar36._20_4_ = uVar155;
      auVar36._24_4_ = uVar155;
      auVar36._28_4_ = uVar155;
      uVar20 = vcmpps_avx512vl(auVar194,auVar36,2);
      uVar91 = (uint)uVar20 & (uint)abStack_180[uVar90 * 0x60];
      bVar78 = (byte)uVar91;
      if (uVar91 != 0) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar195,auVar106);
        auVar145._0_4_ =
             (uint)(bVar78 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)auVar106._0_4_;
        bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * (int)auVar106._4_4_;
        bVar12 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * (int)auVar106._8_4_;
        bVar12 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * (int)auVar106._12_4_;
        bVar12 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar145._16_4_ = (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * (int)auVar106._16_4_;
        bVar12 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar145._20_4_ = (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * (int)auVar106._20_4_;
        bVar12 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar145._24_4_ = (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * (int)auVar106._24_4_;
        auVar145._28_4_ =
             (uVar91 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar91 >> 7,0) * (int)auVar106._28_4_;
        auVar106 = vshufps_avx(auVar145,auVar145,0xb1);
        auVar106 = vminps_avx(auVar145,auVar106);
        auVar104 = vshufpd_avx(auVar106,auVar106,5);
        auVar106 = vminps_avx(auVar106,auVar104);
        auVar104 = vpermpd_avx2(auVar106,0x4e);
        auVar106 = vminps_avx(auVar106,auVar104);
        uVar20 = vcmpps_avx512vl(auVar145,auVar106,0);
        bVar85 = (byte)uVar20 & bVar78;
        if (bVar85 != 0) {
          uVar91 = (uint)bVar85;
        }
        fVar153 = afStack_138[uVar90 * 0x18 + -1];
        uVar146 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          uVar146 = uVar146 + 1;
        }
        local_918 = (ulong)(uint)afStack_138[uVar90 * 0x18];
        bVar85 = ~('\x01' << ((byte)uVar146 & 0x1f)) & bVar78;
        abStack_180[uVar90 * 0x60] = bVar85;
        uVar82 = uVar90;
        if (bVar85 != 0) {
          uVar82 = local_910;
        }
        fVar241 = *(float *)(&uStack_140 + uVar90 * 0xc);
        auVar196._4_4_ = fVar241;
        auVar196._0_4_ = fVar241;
        auVar196._8_4_ = fVar241;
        auVar196._12_4_ = fVar241;
        auVar196._16_4_ = fVar241;
        auVar196._20_4_ = fVar241;
        auVar196._24_4_ = fVar241;
        auVar196._28_4_ = fVar241;
        fVar153 = fVar153 - fVar241;
        auVar172._4_4_ = fVar153;
        auVar172._0_4_ = fVar153;
        auVar172._8_4_ = fVar153;
        auVar172._12_4_ = fVar153;
        auVar172._16_4_ = fVar153;
        auVar172._20_4_ = fVar153;
        auVar172._24_4_ = fVar153;
        auVar172._28_4_ = fVar153;
        auVar95 = vfmadd132ps_fma(auVar172,auVar196,_DAT_02020f20);
        auVar106 = ZEXT1632(auVar95);
        local_5a0[0] = (RTCHitN)auVar106[0];
        local_5a0[1] = (RTCHitN)auVar106[1];
        local_5a0[2] = (RTCHitN)auVar106[2];
        local_5a0[3] = (RTCHitN)auVar106[3];
        local_5a0[4] = (RTCHitN)auVar106[4];
        local_5a0[5] = (RTCHitN)auVar106[5];
        local_5a0[6] = (RTCHitN)auVar106[6];
        local_5a0[7] = (RTCHitN)auVar106[7];
        local_5a0[8] = (RTCHitN)auVar106[8];
        local_5a0[9] = (RTCHitN)auVar106[9];
        local_5a0[10] = (RTCHitN)auVar106[10];
        local_5a0[0xb] = (RTCHitN)auVar106[0xb];
        local_5a0[0xc] = (RTCHitN)auVar106[0xc];
        local_5a0[0xd] = (RTCHitN)auVar106[0xd];
        local_5a0[0xe] = (RTCHitN)auVar106[0xe];
        local_5a0[0xf] = (RTCHitN)auVar106[0xf];
        local_5a0[0x10] = (RTCHitN)auVar106[0x10];
        local_5a0[0x11] = (RTCHitN)auVar106[0x11];
        local_5a0[0x12] = (RTCHitN)auVar106[0x12];
        local_5a0[0x13] = (RTCHitN)auVar106[0x13];
        local_5a0[0x14] = (RTCHitN)auVar106[0x14];
        local_5a0[0x15] = (RTCHitN)auVar106[0x15];
        local_5a0[0x16] = (RTCHitN)auVar106[0x16];
        local_5a0[0x17] = (RTCHitN)auVar106[0x17];
        local_5a0[0x18] = (RTCHitN)auVar106[0x18];
        local_5a0[0x19] = (RTCHitN)auVar106[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar106[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar106[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar106[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar106[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar106[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar106[0x1f];
        auVar213 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar146 * 4));
        uVar90 = uVar82;
      }
      local_910 = uVar90;
    } while (bVar78 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }